

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::compSyncResidualFine
          (MLNodeLaplacian *this,MultiFab *sync_resid,MultiFab *phi,MultiFab *vold,MultiFab *rhcc)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Real RVar11;
  pointer paVar12;
  EBCellFlagFab *this_00;
  pointer paVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  double *pdVar22;
  int i_1;
  FabType FVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  int *piVar28;
  DataAllocator DVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  bool bVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  double *pdVar48;
  long lVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  double *pdVar75;
  long lVar76;
  double *pdVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  bool bVar82;
  bool bVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  Real RVar98;
  double dVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  ulong uVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  undefined1 auVar108 [16];
  double dVar109;
  double dVar110;
  double dVar111;
  int iVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  Box bx_3;
  Box lhs;
  Box bx_2;
  Box bx;
  Box result;
  Real facz;
  Real facy;
  Real facx;
  Box bx_5;
  MFIter mfi;
  Box bx_4;
  Box bx_1;
  FArrayBox cn;
  FArrayBox sten;
  FArrayBox u;
  IArrayBox tmpmask;
  FArrayBox rhs;
  Real fm2xm2y4z;
  Real f2x2ymz;
  Real f2xmy2z;
  Real fmx2y2z;
  Real fxyz;
  Real fm2x4ym2z;
  Real f4xm2ym2z;
  Real facy_2;
  Real facx_2;
  Real facz_2;
  Elixir steneli;
  Elixir rhseli;
  Elixir tmeli;
  Elixir ueli;
  Elixir cneli;
  double *local_c80;
  long local_c78;
  long local_c70;
  long local_c68;
  double *local_c60;
  long local_c58;
  double *local_c50;
  long local_c48;
  long local_c40;
  long local_c30;
  double *local_c28;
  long local_c20;
  long local_c18;
  double *local_c10;
  long local_c00;
  long local_bf8;
  double *local_be8;
  long local_be0;
  double *local_bd8;
  long local_bd0;
  long local_bc8;
  long local_bc0;
  long local_bb8;
  long local_bb0;
  double *local_ba8;
  long local_ba0;
  long local_b98;
  long local_b88;
  long local_b80;
  double *local_b78;
  long local_b58;
  long local_b50;
  double *local_b40;
  long local_b38;
  long local_b28;
  long local_b18;
  long local_b10;
  long local_b08;
  long local_b00;
  long local_ae8;
  long local_ae0;
  long local_ad8;
  long local_ad0;
  Box local_ac8;
  ulong local_aa0;
  long local_a98;
  long local_a90;
  long local_a88;
  long local_a80;
  long local_a78;
  long local_a70;
  double *local_a68;
  long local_a60;
  long local_a58;
  ulong local_a50;
  double *local_a48;
  long local_a40;
  long local_a38;
  long local_a30;
  long local_a28;
  double *local_a20;
  ulong local_a18;
  int local_a0c;
  long local_a08;
  long local_a00;
  long local_9f8;
  long local_9f0;
  long local_9e8;
  long local_9e0;
  Box local_9d8;
  long local_9b8;
  long local_9b0;
  int *local_9a8;
  double *local_9a0;
  double *local_998;
  long local_990;
  long local_988;
  ulong local_980;
  LinOpBCType local_978;
  LinOpBCType local_974;
  long local_970;
  long local_968;
  ulong local_960;
  ulong local_958;
  long local_950;
  double *local_948;
  long local_940;
  undefined8 local_938;
  long local_930;
  long local_928;
  long local_920;
  long local_918;
  long local_910;
  double *local_908;
  long local_900;
  long local_8f8;
  long local_8f0;
  ulong local_8e8;
  long local_8e0;
  long local_8d8;
  long local_8d0;
  long local_8c8;
  long local_8c0;
  ulong local_8b8;
  long local_8b0;
  long local_8a8;
  long local_8a0;
  long local_898;
  long local_890;
  long local_888;
  double *local_880;
  MLNodeLaplacian *local_878;
  ulong local_870;
  long local_868;
  long local_860;
  long local_858;
  long local_850;
  long local_848;
  undefined4 local_83c;
  undefined8 local_838;
  int iStack_830;
  int aiStack_82c [5];
  undefined8 local_818;
  int local_810;
  int local_80c [2];
  undefined8 uStack_804;
  FabArray<amrex::FArrayBox> *local_7f0;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_7e8;
  long local_7e0;
  long local_7d8;
  long local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  ulong local_7b8;
  ulong local_7b0;
  undefined8 local_7a8;
  int iStack_7a0;
  int aiStack_79c [2];
  undefined8 uStack_794;
  Box local_788;
  undefined8 local_768;
  int iStack_760;
  int iStack_75c;
  uint local_758;
  int local_754;
  FabArray<amrex::EBCellFlagFab> *local_748;
  long local_740;
  long local_738;
  long local_730;
  ulong local_728;
  int local_720;
  Box local_71c;
  Array4<const_double> local_700;
  Array4<const_double> local_6c0;
  long local_680;
  undefined8 *local_678;
  FabArray<amrex::FArrayBox> *local_670;
  FabArray<amrex::FArrayBox> *local_668;
  long local_660;
  long local_658;
  double local_650;
  double local_648;
  double local_640;
  int local_638;
  int local_634;
  int local_62c [5];
  Array4<const_double> local_618;
  MFIter local_5d8;
  Array4<const_amrex::EBCellFlag> local_578;
  FabArray<amrex::FArrayBox> *local_538;
  FabArray<amrex::IArrayBox> *local_530;
  long local_528;
  FabArray<amrex::FArrayBox> *local_520;
  long local_518;
  ulong local_510;
  long local_508;
  long local_500;
  long local_4f8;
  long local_4f0;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  long local_4d0;
  undefined1 local_4c8 [24];
  IndexType IStack_4b0;
  undefined4 uStack_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  BaseFab<double> local_480;
  BaseFab<double> local_438;
  BaseFab<double> local_3f0;
  BaseFab<int> local_3a8;
  BaseFab<double> local_360;
  double local_318;
  undefined8 uStack_310;
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  undefined8 uStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  double local_298;
  undefined8 uStack_290;
  double local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  double local_268;
  undefined8 uStack_260;
  double local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  double local_238;
  undefined8 uStack_230;
  double local_228;
  undefined8 uStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  Array4<const_double> local_1b8;
  Elixir local_178;
  Elixir local_160;
  Elixir local_148;
  Elixir local_130;
  Array4<const_double> local_118;
  Array4<const_int> local_d8;
  Box local_98;
  Box local_7c;
  Elixir local_60;
  MFItInfo local_44;
  
  local_520 = &vold->super_FabArray<amrex::FArrayBox>;
  local_538 = &phi->super_FabArray<amrex::FArrayBox>;
  local_678 = *(undefined8 **)
               &(((this->m_sigma).
                  super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                ).
                super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  local_530 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                   super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  paVar12 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_728 = *(ulong *)paVar12->_M_elems;
  local_974 = paVar12->_M_elems[2];
  paVar12 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_7c0 = *(ulong *)paVar12->_M_elems;
  local_978 = paVar12->_M_elems[2];
  lVar27 = **(long **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  local_878 = this;
  local_670 = &sync_resid->super_FabArray<amrex::FArrayBox>;
  local_668 = &rhcc->super_FabArray<amrex::FArrayBox>;
  if ((lVar27 == 0) ||
     (lVar27 = __dynamic_cast(lVar27,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0), lVar27 == 0)) {
    local_7e8._M_head_impl =
         *(MultiFab **)
          &(((local_878->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    local_83c = (undefined4)CONCAT71(SUB87(local_7e8._M_head_impl,1),1);
    local_748 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_7f0 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_748 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar27 + 0xd8));
    local_7e8._M_head_impl =
         *(MultiFab **)
          &(((local_878->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    local_7f0 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar27 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
    local_83c = 0;
  }
  lVar27 = *(long *)&(((local_878->super_MLNodeLinOp).super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_528 = lVar27 + 0xac;
  local_7a8 = *(undefined8 *)(lVar27 + 0xac);
  aiStack_79c[1] = (int)((ulong)*(undefined8 *)(lVar27 + 0xb8) >> 0x20);
  uStack_794 = *(undefined8 *)(lVar27 + 0xc0);
  iStack_7a0 = (int)*(undefined8 *)(lVar27 + 0xb4);
  aiStack_79c[0] = (int)((ulong)*(undefined8 *)(lVar27 + 0xb4) >> 0x20);
  lVar34 = 0;
  do {
    if ((uStack_794._4_4_ >> ((uint)lVar34 & 0x1f) & 1) == 0) {
      aiStack_79c[lVar34] = aiStack_79c[lVar34] + 1;
    }
    lVar34 = lVar34 + 1;
  } while (lVar34 != 3);
  uStack_794 = CONCAT44(7,(int)uStack_794);
  dVar90 = *(double *)(lVar27 + 0x38);
  dVar113 = *(double *)(lVar27 + 0x40);
  dVar106 = *(double *)(lVar27 + 0x48);
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_00810ec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  FArrayBox::FArrayBox((FArrayBox *)&local_360);
  FArrayBox::FArrayBox((FArrayBox *)&local_3f0);
  IArrayBox::IArrayBox((IArrayBox *)&local_3a8);
  FArrayBox::FArrayBox((FArrayBox *)&local_438);
  FArrayBox::FArrayBox((FArrayBox *)&local_480);
  MFIter::MFIter(&local_5d8,&local_670->super_FabArrayBase,&local_44);
  if (local_5d8.currentIndex < local_5d8.endIndex) {
    local_640 = dVar90 * 0.25;
    local_648 = dVar113 * 0.25;
    local_650 = dVar106 * 0.25;
    local_7b0 = local_728 >> 0x20;
    local_7b8 = local_7c0 >> 0x20;
    local_1d8 = dVar90 * 0.027777777777777776 * dVar90;
    local_1e8._0_8_ = dVar113 * 0.027777777777777776 * dVar113;
    local_1e8._8_8_ = 0;
    local_1c8 = dVar106 * 0.027777777777777776 * dVar106;
    local_278._0_8_ = (double)local_1e8._0_8_ + (double)local_1e8._0_8_;
    local_278._8_8_ = 0;
    local_288 = local_1d8 * 4.0;
    uStack_280 = 0;
    local_208 = (local_288 - (double)local_278._0_8_) + local_1c8 * -2.0;
    uStack_200 = 0;
    local_298 = (double)local_1e8._0_8_ * 4.0;
    local_2a8 = local_1d8 * -2.0;
    uStack_290 = 0;
    local_218 = local_2a8 + local_298 + local_1c8 * -2.0;
    uStack_210 = 0;
    local_228 = local_1d8 + (double)local_1e8._0_8_ + local_1c8;
    uStack_220 = 0;
    local_2b8 = -local_1d8;
    uStack_2b0 = 0x8000000000000000;
    local_1f8 = local_1c8 + local_1c8;
    local_238 = ((double)local_278._0_8_ - local_1d8) + local_1f8;
    uStack_230 = 0;
    local_2c8 = -(double)local_1e8._0_8_;
    uStack_2c0 = 0x8000000000000000;
    uStack_1d0 = 0;
    local_2d8 = local_1d8 + local_1d8;
    local_248._0_8_ = (local_2d8 - (double)local_1e8._0_8_) + local_1f8;
    local_248._8_8_ = 0;
    uStack_2d0 = 0;
    local_258 = (local_2d8 + (double)local_278._0_8_) - local_1c8;
    uStack_250 = 0;
    local_2e8 = -(double)local_278._0_8_;
    uStack_2e0 = 0x8000000000000000;
    uStack_2a0 = 0;
    local_2f8 = local_1c8 * 4.0;
    uStack_2f0 = 0;
    local_268 = (local_2a8 - (double)local_278._0_8_) + local_2f8;
    uStack_260 = 0;
    uStack_1f0 = 0;
    local_308 = -local_1f8;
    uStack_300 = 0x8000000000000000;
    uStack_1c0 = 0;
    local_318 = -local_1c8;
    uStack_310 = 0x8000000000000000;
    do {
      MFIter::tilebox(&local_ac8,&local_5d8);
      local_8b8 = local_8b8 & 0xffffffff00000000;
      if ((char)local_83c == '\0') {
        piVar28 = &local_5d8.currentIndex;
        if (local_5d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar28 = ((local_5d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_5d8.currentIndex;
        }
        this_00 = (local_748->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar28];
        local_4c8._16_4_ = local_ac8.bigend.vect[1];
        local_4c8._20_4_ = local_ac8.bigend.vect[2];
        local_4c8._0_8_ = CONCAT44(local_ac8.smallend.vect[1],local_ac8.smallend.vect[0]);
        local_4c8._8_4_ = local_ac8.smallend.vect[2];
        local_4c8._12_4_ = local_ac8.bigend.vect[0];
        lVar27 = 0;
        do {
          if ((local_ac8.btype.itype >> ((uint)lVar27 & 0x1f) & 1) != 0) {
            *(int *)(local_4c8 + lVar27 * 4 + 0xc) = *(int *)(local_4c8 + lVar27 * 4 + 0xc) + -1;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        IStack_4b0.itype = 0;
        FVar23 = EBCellFlagFab::getType(this_00,(Box *)local_4c8);
        local_8b8 = CONCAT44(local_8b8._4_4_,FVar23);
        if (FVar23 != covered) goto LAB_00675fdd;
      }
      else {
LAB_00675fdd:
        MFIter::growntilebox(&local_71c,&local_5d8,-1000000);
        BATransformer::operator()
                  (&local_7c,&((local_5d8.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_5d8.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_5d8.currentIndex] * 0x1c +
                          *(long *)&((((local_5d8.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        local_80c[1] = local_7c.bigend.vect[1];
        uStack_804._0_4_ = local_7c.bigend.vect[2];
        uStack_804._4_4_ = local_7c.btype.itype;
        local_818._0_4_ = local_7c.smallend.vect[0];
        local_818._4_4_ = local_7c.smallend.vect[1];
        local_810 = local_7c.smallend.vect[2];
        local_80c[0] = local_7c.bigend.vect[0];
        lVar27 = 0;
        do {
          if ((uStack_804._4_4_ >> ((uint)lVar27 & 0x1f) & 1) != 0) {
            local_80c[lVar27] = local_80c[lVar27] + -1;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        uStack_804 = uStack_804 & 0xffffffff;
        local_9d8.smallend.vect[0] = local_ac8.smallend.vect[0] + -1;
        local_9d8.smallend.vect[1] = local_ac8.smallend.vect[1] + -1;
        local_9d8.smallend.vect[2] = local_ac8.smallend.vect[2] + -1;
        local_9d8.bigend.vect[0] = local_ac8.bigend.vect[0] + 1;
        local_9d8.bigend.vect[1] = local_ac8.bigend.vect[1] + 1;
        local_9d8.bigend.vect[2] = local_ac8.bigend.vect[2] + 1;
        lVar27 = 0;
        do {
          if ((local_ac8.btype.itype >> ((uint)lVar27 & 0x1f) & 1) != 0) {
            piVar28 = local_9d8.bigend.vect + lVar27;
            *piVar28 = *piVar28 + -1;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        local_9d8.btype.itype = 0;
        FArrayBox::resize((FArrayBox *)&local_3f0,&local_9d8,3,(Arena *)0x0);
        DVar29.m_arena = local_3f0.super_DataAllocator.m_arena;
        if (local_3f0.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar29.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_130,(void *)0x0,DVar29.m_arena);
        iVar33 = local_3f0.domain.smallend.vect[2];
        iVar50 = local_3f0.domain.smallend.vect[1];
        iVar18 = local_3f0.domain.smallend.vect[0];
        pdVar22 = local_3f0.dptr;
        lVar60 = (long)local_3f0.domain.smallend.vect[0];
        lVar51 = (long)local_3f0.domain.smallend.vect[1];
        lVar54 = (long)local_3f0.domain.smallend.vect[2];
        lVar27 = (long)((local_3f0.domain.bigend.vect[1] - local_3f0.domain.smallend.vect[1]) + 1);
        lVar34 = (long)((local_3f0.domain.bigend.vect[2] - local_3f0.domain.smallend.vect[2]) + 1);
        uVar103 = CONCAT44(-(uint)(local_9d8.smallend.vect[1] < (int)(local_818 >> 0x20)),
                           -(uint)(local_9d8.smallend.vect[0] < (int)local_818));
        local_838 = ~uVar103 & CONCAT44(local_9d8.smallend.vect[1],local_9d8.smallend.vect[0]) |
                    local_818 & uVar103;
        iStack_830 = local_9d8.smallend.vect[2];
        if (local_9d8.smallend.vect[2] < local_810) {
          iStack_830 = local_810;
        }
        uVar103 = CONCAT44(-(uint)(local_80c[1] < local_9d8.bigend.vect[1]),
                           -(uint)(local_80c[0] < local_9d8.bigend.vect[0]));
        uVar103 = ~uVar103 & CONCAT44(local_9d8.bigend.vect[1],local_9d8.bigend.vect[0]) |
                  CONCAT44(local_80c[1],local_80c[0]) & uVar103;
        aiStack_82c[0] = (int)uVar103;
        aiStack_82c[1] = (int)(uVar103 >> 0x20);
        aiStack_82c[2] = (int)uStack_804;
        iVar24 = local_9d8.bigend.vect[2];
        if (aiStack_82c[2] < local_9d8.bigend.vect[2]) {
          iVar24 = aiStack_82c[2];
        }
        aiStack_82c[3] = (int)(uStack_804 >> 0x20);
        aiStack_82c[2] = iVar24;
        paVar12 = (local_878->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar13 = (local_878->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar44 = 0;
        do {
          if ((*(int *)((long)paVar12->_M_elems + lVar44) == 0x6a) &&
             (*(int *)((long)&local_838 + lVar44) == *(int *)(local_528 + lVar44))) {
            *(int *)((long)&local_838 + lVar44) = *(int *)((long)&local_838 + lVar44) + -1;
          }
          if ((*(int *)((long)paVar13->_M_elems + lVar44) == 0x6a) &&
             (*(int *)((long)aiStack_82c + lVar44) == *(int *)(local_528 + 0xc + lVar44))) {
            *(int *)((long)aiStack_82c + lVar44) = *(int *)((long)aiStack_82c + lVar44) + 1;
          }
          lVar44 = lVar44 + 4;
        } while (lVar44 != 0xc);
        lVar44 = (long)((local_3f0.domain.bigend.vect[0] - local_3f0.domain.smallend.vect[0]) + 1);
        lVar35 = lVar27 * lVar44;
        lVar36 = lVar35 * lVar34;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_4c8,local_520,&local_5d8);
        lVar30 = (long)local_9d8.smallend.vect[2];
        if (local_9d8.smallend.vect[2] <= local_9d8.bigend.vect[2]) {
          lVar78 = (long)local_9d8.smallend.vect[1];
          lVar76 = (long)local_9d8.smallend.vect[0];
          local_c58 = (lVar78 * 8 + (lVar30 - lVar54) * lVar27 * 8 + lVar51 * -8) * lVar44 +
                      lVar76 * 8 + lVar60 * -8 + (long)pdVar22;
          local_bd0 = ((lVar34 * 8 + lVar30 * 8 + lVar54 * -8) * lVar27 + lVar78 * 8 + lVar51 * -8)
                      * lVar44 + lVar76 * 8 + lVar60 * -8 + (long)pdVar22;
          do {
            if (local_9d8.smallend.vect[1] <= local_9d8.bigend.vect[1]) {
              lVar38 = lVar78;
              lVar41 = local_bd0;
              lVar45 = local_c58;
              do {
                if (local_9d8.smallend.vect[0] <= local_9d8.bigend.vect[0]) {
                  lVar55 = (long)local_4a8;
                  lVar80 = (lVar30 - local_4a0) * CONCAT44(local_4c8._20_4_,local_4c8._16_4_);
                  lVar39 = (lVar38 - local_4a4) * CONCAT44(local_4c8._12_4_,local_4c8._8_4_);
                  lVar40 = 0;
                  lVar56 = lVar76;
                  do {
                    if ((((lVar40 + lVar76 < (long)(int)local_838) || (lVar38 < local_838._4_4_)) ||
                        (lVar30 < iStack_830)) ||
                       ((((long)aiStack_82c[0] < lVar40 + lVar76 || (aiStack_82c[1] < lVar38)) ||
                        (aiStack_82c[2] < lVar30)))) {
                      lVar71 = (lVar76 - lVar60) + lVar40;
                      *(undefined8 *)(lVar45 + lVar40 * 8) = 0;
                      *(undefined8 *)(lVar41 + lVar40 * 8) = 0;
                      dVar90 = 0.0;
                    }
                    else {
                      lVar71 = lVar56 - lVar60;
                      *(double *)(lVar45 + lVar40 * 8) =
                           *(double *)
                            (local_4c8._0_8_ + (lVar76 + ((lVar80 + lVar39 + lVar40) - lVar55)) * 8)
                      ;
                      *(double *)(lVar41 + lVar40 * 8) =
                           *(double *)
                            (local_4c8._0_8_ +
                            (lVar76 + ((CONCAT44(uStack_4ac,IStack_4b0.itype) +
                                       lVar80 + lVar39 + lVar40) - lVar55)) * 8);
                      dVar90 = *(double *)
                                (local_4c8._0_8_ +
                                (lVar76 + ((lVar80 + lVar39 + CONCAT44(uStack_4ac,IStack_4b0.itype)
                                                              * 2 + lVar40) - lVar55)) * 8);
                    }
                    pdVar22[(lVar30 - lVar54) * lVar35 +
                            (lVar38 - lVar51) * lVar44 + lVar36 * 2 + lVar71] = dVar90;
                    lVar56 = lVar56 + 1;
                    lVar40 = lVar40 + 1;
                  } while ((local_9d8.bigend.vect[0] - local_9d8.smallend.vect[0]) + 1 !=
                           (int)lVar40);
                }
                lVar38 = lVar38 + 1;
                lVar45 = lVar45 + lVar44 * 8;
                lVar41 = lVar41 + lVar44 * 8;
              } while (local_9d8.bigend.vect[1] + 1 != (int)lVar38);
            }
            lVar30 = lVar30 + 1;
            local_c58 = local_c58 + lVar35 * 8;
            local_bd0 = local_bd0 + lVar35 * 8;
          } while (local_9d8.bigend.vect[2] + 1 != (int)lVar30);
        }
        IArrayBox::resize((IArrayBox *)&local_3a8,&local_ac8,1,(Arena *)0x0);
        DVar29.m_arena = local_3a8.super_DataAllocator.m_arena;
        if (local_3a8.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar29.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_148,(void *)0x0,DVar29.m_arena);
        local_9a8 = local_3a8.dptr;
        local_920 = (long)local_3a8.domain.smallend.vect[0];
        local_a40 = (long)local_3a8.domain.smallend.vect[1];
        local_910 = (long)local_3a8.domain.smallend.vect[2];
        local_940 = (long)((local_3a8.domain.bigend.vect[0] - local_3a8.domain.smallend.vect[0]) + 1
                          );
        local_a38 = (long)((local_3a8.domain.bigend.vect[1] - local_3a8.domain.smallend.vect[1]) + 1
                          );
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d8,local_530,&local_5d8)
        ;
        lVar30 = (long)local_ac8.smallend.vect[2];
        if (local_ac8.smallend.vect[2] <= local_ac8.bigend.vect[2]) {
          local_c68 = ((long)local_ac8.smallend.vect[1] * 4 + (lVar30 - local_910) * local_a38 * 4 +
                      local_a40 * -4) * local_940 + (long)local_ac8.smallend.vect[0] * 4 +
                      local_920 * -4 + (long)local_9a8;
          do {
            if (local_ac8.smallend.vect[1] <= local_ac8.bigend.vect[1]) {
              lVar76 = (long)local_ac8.smallend.vect[1];
              lVar78 = local_c68;
              do {
                if (local_ac8.smallend.vect[0] <= local_ac8.bigend.vect[0]) {
                  lVar38 = 0;
                  do {
                    *(int *)(lVar78 + lVar38 * 4) =
                         1 - *(int *)((long)local_d8.p +
                                     lVar38 * 4 +
                                     (lVar76 - local_d8.begin.y) * local_d8.jstride * 4 +
                                     (lVar30 - local_d8.begin.z) * local_d8.kstride * 4 +
                                     (long)local_d8.begin.x * -4 +
                                     (long)local_ac8.smallend.vect[0] * 4);
                    lVar38 = lVar38 + 1;
                  } while ((local_ac8.bigend.vect[0] - local_ac8.smallend.vect[0]) + 1 !=
                           (int)lVar38);
                }
                lVar76 = lVar76 + 1;
                lVar78 = lVar78 + local_940 * 4;
              } while (local_ac8.bigend.vect[1] + 1U != (int)lVar76);
            }
            lVar30 = lVar30 + 1;
            local_c68 = local_c68 + local_a38 * local_940 * 4;
          } while (local_ac8.bigend.vect[2] + 1 != (int)lVar30);
        }
        FArrayBox::resize((FArrayBox *)&local_360,&local_ac8,1,(Arena *)0x0);
        DVar29.m_arena = local_360.super_DataAllocator.m_arena;
        if (local_360.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar29.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_160,(void *)0x0,DVar29.m_arena);
        local_948 = local_360.dptr;
        local_8c0 = (long)local_360.domain.smallend.vect[0];
        local_a00 = (long)local_360.domain.smallend.vect[1];
        local_8a8 = (long)local_360.domain.smallend.vect[2];
        local_9f8 = (long)((local_360.domain.bigend.vect[0] - local_360.domain.smallend.vect[0]) + 1
                          );
        local_a08 = (long)((local_360.domain.bigend.vect[1] - local_360.domain.smallend.vect[1]) + 1
                          );
        if ((int)local_8b8 == 1) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_6c0,local_7f0,&local_5d8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_700,&(local_7e8._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                     &local_5d8);
          local_bb0 = (long)local_ac8.smallend.vect[2];
          local_a0c = local_ac8.bigend.vect[2];
          if (local_ac8.smallend.vect[2] <= local_ac8.bigend.vect[2]) {
            local_9b8 = (long)local_ac8.smallend.vect[1];
            local_950 = (long)local_ac8.smallend.vect[0];
            lVar30 = local_9b8 * 8;
            local_9f0 = local_bb0 + -1;
            lVar78 = lVar34 * 0x10 + local_bb0 * 8 + lVar54 * -8;
            lVar36 = (lVar78 + -8) * lVar27 + local_9b8 * 8 + lVar51 * -8;
            lVar76 = ((local_bb0 + lVar34) * 8 + lVar54 * -8 + -8) * lVar27 + local_9b8 * 8 +
                     lVar51 * -8;
            lVar38 = lVar30 + (local_9f0 - lVar54) * lVar27 * 8 + lVar51 * -8;
            lVar41 = lVar78 * lVar27 + local_9b8 * 8 + lVar51 * -8;
            lVar78 = (lVar34 * 8 + local_bb0 * 8 + lVar54 * -8) * lVar27 + local_9b8 * 8 +
                     lVar51 * -8;
            lVar34 = lVar30 + (local_bb0 - lVar54) * lVar27 * 8 + lVar51 * -8;
            local_a0c = local_ac8.bigend.vect[2] + 1;
            local_968 = (lVar30 + (local_bb0 - local_8a8) * local_a08 * 8 + local_a00 * -8) *
                        local_9f8 + local_950 * 8 + local_8c0 * -8 + (long)local_948;
            local_918 = local_a08 * local_9f8 * 8;
            local_a20 = (double *)(aiStack_79c[0] - local_950);
            local_998 = (double *)((int)local_7a8 - local_950);
            local_900 = (lVar36 + -8) * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_908 = (double *)
                        ((lVar76 + -8) * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22);
            local_880 = (double *)
                        ((lVar38 + -8) * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22);
            local_888 = (lVar41 + -8) * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_890 = (lVar78 + -8) * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_898 = (lVar34 + -8) * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_8a0 = lVar36 * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_970 = lVar76 * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_848 = lVar38 * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_850 = lVar41 * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_858 = lVar78 * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_860 = lVar34 * lVar44 + local_950 * 8 + lVar60 * -8 + (long)pdVar22;
            local_868 = (local_9b8 * 4 + (local_bb0 - local_910) * local_a38 * 4 + local_a40 * -4) *
                        local_940 + local_950 * 4 + local_920 * -4 + (long)local_9a8;
            local_8b0 = local_a38 * local_940 * 4;
            local_958 = CONCAT44(local_958._4_4_,local_ac8.bigend.vect[0]);
            local_7c8 = (ulong)(uint)local_ac8.bigend.vect[1];
            local_928 = (long)local_7a8._4_4_;
            local_9e0 = (long)iStack_7a0;
            local_930 = (long)aiStack_79c[1];
            local_9e8 = (long)(int)uStack_794;
            local_8e8 = CONCAT44(local_8e8._4_4_,local_ac8.bigend.vect[1] + 1U);
            local_9b0 = local_950 * 8;
            local_a30 = local_9f8 * 8;
            local_738 = local_9b8 + -1;
            local_730 = lVar35 * 8;
            local_960 = lVar44 * 8;
            local_8f0 = local_940 * 4;
            do {
              if (local_ac8.smallend.vect[1] <= local_ac8.bigend.vect[1]) {
                bVar43 = local_bb0 == local_9e0 && local_974 == inflow;
                local_938 = CONCAT71(local_938._1_7_,bVar43);
                bVar32 = local_bb0 == local_9e8 && local_978 == inflow;
                local_9a0 = (double *)CONCAT71(local_9a0._1_7_,bVar32);
                local_b00 = local_860;
                local_b08 = local_858;
                local_b38 = local_850;
                local_b40 = (double *)local_848;
                local_b88 = local_970;
                local_b10 = local_8a0;
                local_ad0 = local_898;
                local_ad8 = local_890;
                local_ae0 = local_888;
                local_a48 = local_880;
                local_a68 = local_908;
                local_b28 = local_900;
                lVar34 = local_868;
                lVar30 = local_968;
                local_c18 = local_9b8;
                local_a28 = local_738;
                do {
                  if (local_ac8.smallend.vect[0] <= local_ac8.bigend.vect[0]) {
                    bVar82 = local_c18 == local_928 && local_7b0 == 0x6a;
                    local_8d8 = CONCAT71(local_8d8._1_7_,bVar82);
                    bVar83 = local_c18 == local_930 && local_7b8 == 0x6a;
                    local_8e0 = CONCAT71(local_8e0._1_7_,bVar83);
                    lVar40 = (long)local_700.begin.x;
                    lVar45 = (local_9f0 - local_700.begin.z) * local_700.kstride * 8;
                    lVar41 = (local_a28 - local_700.begin.y) * local_700.jstride * 8;
                    lVar36 = lVar45 + lVar41;
                    lVar56 = local_700.nstride * 0x38;
                    lVar76 = (local_bb0 - local_700.begin.z) * local_700.kstride * 8;
                    lVar41 = lVar41 + lVar76;
                    lVar80 = (local_c18 - local_700.begin.y) * local_700.jstride * 8;
                    lVar45 = lVar45 + lVar80;
                    lVar80 = lVar80 + lVar76;
                    lVar39 = local_700.nstride * 0x10;
                    lVar76 = local_700.nstride * 0x30;
                    lVar55 = local_700.nstride * 0x40;
                    local_a80 = (long)local_700.p + lVar36 + lVar76 + lVar40 * -8 + local_9b0;
                    local_a88 = (long)local_700.p + lVar36 + lVar56 + lVar40 * -8 + local_9b0;
                    lVar78 = lVar36 + lVar40 * -8 + local_9b0;
                    local_a90 = (long)local_700.p + lVar36 + lVar55 + lVar40 * -8 + local_9b0;
                    local_a98 = (long)local_700.p + lVar36 + lVar39 + lVar40 * -8 + local_9b0;
                    lVar36 = lVar36 + local_700.nstride * 8 + lVar40 * -8 + local_9b0;
                    local_8d0 = (long)local_700.p + lVar76 + lVar41 + lVar40 * -8 + local_9b0;
                    lVar38 = lVar56 + lVar41 + lVar40 * -8 + local_9b0;
                    local_a60 = (long)local_700.p + lVar41 + lVar40 * -8 + local_9b0;
                    local_a50 = (long)local_700.p + lVar55 + lVar41 + lVar40 * -8 + local_9b0;
                    local_a58 = (long)local_700.p + lVar39 + lVar41 + lVar40 * -8 + local_9b0;
                    local_a78 = (long)local_700.p +
                                local_700.nstride * 8 + lVar41 + lVar40 * -8 + local_9b0;
                    local_980 = (long)local_700.p + lVar45 + lVar76 + lVar40 * -8 + local_9b0;
                    local_988 = (long)local_700.p + lVar45 + lVar56 + lVar40 * -8 + local_9b0;
                    local_8c8 = (long)local_700.p + lVar45 + lVar40 * -8 + local_9b0;
                    local_990 = (long)local_700.p + lVar45 + lVar55 + lVar40 * -8 + local_9b0;
                    lVar41 = lVar45 + lVar39 + lVar40 * -8 + local_9b0;
                    lVar45 = lVar45 + local_700.nstride * 8 + lVar40 * -8 + local_9b0;
                    local_aa0 = (long)local_700.p + lVar76 + lVar80 + lVar40 * -8 + local_9b0;
                    lVar76 = lVar56 + lVar80 + lVar40 * -8 + local_9b0;
                    lVar56 = lVar80 + lVar40 * -8 + local_9b0;
                    local_a18 = (long)local_700.p + lVar55 + lVar80 + lVar40 * -8 + local_9b0;
                    lVar39 = lVar39 + lVar80 + lVar40 * -8 + local_9b0;
                    lVar40 = local_700.nstride * 8 + lVar80 + lVar40 * -8 + local_9b0;
                    lVar71 = (local_9f0 - local_6c0.begin.z) * local_6c0.kstride * 8;
                    lVar46 = (local_bb0 - local_6c0.begin.z) * local_6c0.kstride * 8;
                    lVar80 = (local_a28 - local_6c0.begin.y) * local_6c0.jstride * 8;
                    lVar31 = (local_c18 - local_6c0.begin.y) * local_6c0.jstride * 8;
                    lVar47 = (long)local_6c0.begin.x;
                    lVar55 = lVar71 + lVar80 + lVar47 * -8 + local_9b0;
                    lVar80 = lVar80 + lVar46 + lVar47 * -8 + local_9b0;
                    lVar71 = lVar71 + lVar31 + lVar47 * -8 + local_9b0;
                    lVar31 = lVar31 + lVar46 + lVar47 * -8 + local_9b0;
                    pdVar48 = (double *)0x0;
                    do {
                      dVar90 = 0.0;
                      if (*(int *)(lVar34 + (long)pdVar48 * 4) == 0) {
                        dVar113 = 1.0;
                        dVar90 = dVar113;
                        if ((int)local_728 == 0x66) {
                          if (local_998 == pdVar48) {
LAB_006773b7:
                            dVar90 = 0.0;
                          }
                        }
                        else if ((int)local_728 == 0x6a && local_998 == pdVar48) goto LAB_006773b7;
                        dVar106 = dVar113;
                        if ((((int)local_7c0 == 0x66) || ((int)local_7c0 == 0x6a)) &&
                           (local_a20 == pdVar48)) {
                          dVar106 = 0.0;
                        }
                        dVar107 = dVar113;
                        if ((int)local_7b0 == 0x66) {
                          if (local_c18 == local_928) {
LAB_0067740a:
                            dVar107 = 0.0;
                          }
                        }
                        else if (bVar82) goto LAB_0067740a;
                        dVar97 = dVar113;
                        if ((int)local_7b8 == 0x66) {
                          if (local_c18 == local_930) {
LAB_0067743b:
                            dVar97 = 0.0;
                          }
                        }
                        else if (bVar83) goto LAB_0067743b;
                        dVar109 = dVar113;
                        if (local_974 == Neumann) {
                          if (local_bb0 == local_9e0) {
LAB_0067746f:
                            dVar109 = 0.0;
                          }
                        }
                        else if (bVar43) goto LAB_0067746f;
                        if (local_978 == Neumann) {
                          if (local_bb0 == local_9e8) {
LAB_006774ae:
                            dVar113 = 0.0;
                          }
                        }
                        else if (bVar32) goto LAB_006774ae;
                        dVar2 = *(double *)(local_a78 + -8 + (long)pdVar48 * 8);
                        dVar84 = *(double *)(local_a78 + (long)pdVar48 * 8);
                        dVar91 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar80 + -8);
                        dVar99 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar80);
                        dVar92 = *(double *)(local_a58 + -8 + (long)pdVar48 * 8);
                        dVar92 = dVar92 + dVar92;
                        dVar93 = *(double *)(local_a58 + (long)pdVar48 * 8);
                        dVar84 = dVar84 + dVar84;
                        dVar93 = dVar93 + dVar93;
                        dVar85 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar40 + -8);
                        dVar3 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar31 + -8);
                        dVar85 = dVar85 + dVar85;
                        dVar118 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar56 + -8);
                        dVar110 = dVar118 + dVar118 + dVar3;
                        dVar118 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar39 + -8);
                        dVar118 = dVar118 + dVar118;
                        dVar86 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar40) * -2.0;
                        dVar4 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar31);
                        dVar104 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar39) * -2.0
                        ;
                        dVar87 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar36 + -8) *
                                 -2.0;
                        dVar5 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar55 + -8);
                        dVar94 = *(double *)(local_a98 + -8 + (long)pdVar48 * 8) * -2.0;
                        dVar88 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar36);
                        dVar88 = dVar88 + dVar88;
                        dVar89 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar78);
                        dVar6 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar55);
                        dVar111 = (dVar89 + dVar89) - dVar6;
                        dVar89 = *(double *)(local_a98 + (long)pdVar48 * 8);
                        dVar89 = dVar89 + dVar89;
                        dVar95 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar45 + -8);
                        dVar95 = dVar95 + dVar95;
                        dVar7 = *(double *)(local_8c8 + -8 + (long)pdVar48 * 8);
                        dVar8 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar71 + -8);
                        dVar96 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar41 + -8);
                        dVar96 = dVar96 + dVar96;
                        dVar105 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar45);
                        dVar105 = dVar105 + dVar105;
                        dVar117 = *(double *)(local_8c8 + (long)pdVar48 * 8);
                        dVar117 = dVar117 + dVar117;
                        dVar9 = *(double *)((long)local_6c0.p + (long)pdVar48 * 8 + lVar71);
                        dVar116 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar41);
                        dVar116 = dVar116 + dVar116;
                        dVar10 = *(double *)(local_a60 + -8 + (long)pdVar48 * 8);
                        dVar114 = *(double *)(local_a60 + (long)pdVar48 * 8);
                        dVar114 = dVar114 + dVar114;
                        dVar115 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar56);
                        dVar119 = dVar4 - (dVar115 + dVar115);
                        dVar115 = *(double *)((long)local_700.p + (long)pdVar48 * 8 + lVar78 + -8) *
                                  -2.0 - dVar5;
                        dVar90 = ((*(double *)(local_980 + (long)pdVar48 * 8) * -4.0 +
                                  (dVar117 - dVar9) + dVar105) *
                                  *(double *)(local_b10 + (long)pdVar48 * 8) * dVar106 * dVar97 +
                                 (*(double *)((local_980 - 8) + (long)pdVar48 * 8) * 4.0 +
                                 (dVar7 * -2.0 - dVar8) + dVar95) *
                                 *(double *)(local_b10 + -8 + (long)pdVar48 * 8) * dVar90 * dVar97 +
                                 (*(double *)(local_a80 + (long)pdVar48 * 8) * 4.0 +
                                 (dVar111 - dVar88)) * *(double *)(local_b28 + (long)pdVar48 * 8) *
                                 dVar106 * dVar107 +
                                 (*(double *)(local_a80 + -8 + (long)pdVar48 * 8) * -4.0 +
                                 dVar115 + dVar87) * *(double *)(local_b28 + -8 + (long)pdVar48 * 8)
                                 * dVar90 * dVar107 +
                                 (*(double *)(local_aa0 + (long)pdVar48 * 8) * 4.0 +
                                 dVar119 + dVar86) * *(double *)(local_b38 + (long)pdVar48 * 8) *
                                 dVar106 * dVar97 +
                                 (*(double *)((local_aa0 - 8) + (long)pdVar48 * 8) * -4.0 +
                                 (dVar110 - dVar85)) *
                                 *(double *)(local_b38 + -8 + (long)pdVar48 * 8) * dVar90 * dVar97 +
                                 (*(double *)(local_8d0 + -8 + (long)pdVar48 * 8) * 4.0 +
                                 dVar2 + dVar2 + dVar10 + dVar10 + dVar91) *
                                 *(double *)(local_ae0 + -8 + (long)pdVar48 * 8) * dVar90 * dVar107
                                 + (*(double *)(local_8d0 + (long)pdVar48 * 8) * -4.0 +
                                   (dVar99 - dVar114) + dVar84) *
                                   *(double *)(local_ae0 + (long)pdVar48 * 8) * dVar106 * dVar107) *
                                 local_650 +
                                 ((*(double *)(local_990 + (long)pdVar48 * 8) * -4.0 +
                                  (dVar9 - dVar105) + dVar116) *
                                  *(double *)((long)local_b40 + (long)pdVar48 * 8) * dVar97 *
                                  dVar109 +
                                 (*(double *)(local_990 + -8 + (long)pdVar48 * 8) * 4.0 +
                                 ((dVar95 - dVar8) - dVar96)) *
                                 *(double *)((long)local_b40 + -8 + (long)pdVar48 * 8) * dVar97 *
                                 dVar109 + (*(double *)(local_a90 + (long)pdVar48 * 8) * 4.0 +
                                           dVar88 + dVar6 + dVar89) * local_a48[(long)pdVar48] *
                                           dVar107 * dVar109 +
                                           (*(double *)(local_a90 + -8 + (long)pdVar48 * 8) * -4.0 +
                                           (dVar87 - dVar5) + dVar94) *
                                           local_a48[(long)pdVar48 + -1] * dVar107 * dVar109 +
                                           (*(double *)(local_a18 + (long)pdVar48 * 8) * 4.0 +
                                           dVar86 + dVar4 + dVar104) *
                                           *(double *)(local_b00 + (long)pdVar48 * 8) * dVar97 *
                                           dVar113 + (*(double *)
                                                       ((local_a18 - 8) + (long)pdVar48 * 8) * -4.0
                                                     + (dVar85 - dVar3) + dVar118) *
                                                     *(double *)(local_b00 + -8 + (long)pdVar48 * 8)
                                                     * dVar97 * dVar113 +
                                                     (*(double *)
                                                       ((local_a50 - 8) + (long)pdVar48 * 8) * 4.0 +
                                                     (dVar2 * -2.0 - dVar91) + dVar92) *
                                                     *(double *)(local_ad0 + -8 + (long)pdVar48 * 8)
                                                     * dVar107 * dVar113 +
                                                     (*(double *)(local_a50 + (long)pdVar48 * 8) *
                                                      -4.0 + ((dVar84 + dVar99) - dVar93)) *
                                                     *(double *)(local_ad0 + (long)pdVar48 * 8) *
                                                     dVar107 * dVar113) * local_640 +
                                 ((*(double *)(local_988 + (long)pdVar48 * 8) * -4.0 +
                                  (dVar9 - dVar117) + dVar116) *
                                  *(double *)(local_b88 + (long)pdVar48 * 8) * dVar106 * dVar109 +
                                 (*(double *)(local_988 + -8 + (long)pdVar48 * 8) * 4.0 +
                                 dVar7 + dVar7 + dVar8 + dVar96) *
                                 *(double *)(local_b88 + -8 + (long)pdVar48 * 8) * dVar90 * dVar109
                                 + (*(double *)(local_a88 + (long)pdVar48 * 8) * 4.0 +
                                   (dVar111 - dVar89)) * local_a68[(long)pdVar48] * dVar106 *
                                   dVar109 + (*(double *)(local_a88 + -8 + (long)pdVar48 * 8) * -4.0
                                             + dVar94 + dVar115) * local_a68[(long)pdVar48 + -1] *
                                             dVar90 * dVar109 +
                                             (*(double *)
                                               ((long)local_700.p + (long)pdVar48 * 8 + lVar76) *
                                              4.0 + dVar104 + dVar119) *
                                             *(double *)(local_b08 + (long)pdVar48 * 8) * dVar106 *
                                             dVar113 + (*(double *)
                                                         ((long)local_700.p +
                                                         (long)pdVar48 * 8 + lVar76 + -8) * -4.0 +
                                                       (dVar110 - dVar118)) *
                                                       *(double *)
                                                        (local_b08 + -8 + (long)pdVar48 * 8) *
                                                       dVar90 * dVar113 +
                                                       (*(double *)
                                                         ((long)local_700.p +
                                                         (long)pdVar48 * 8 + lVar38 + -8) * 4.0 +
                                                       (dVar10 * -2.0 - dVar91) + dVar92) *
                                                       *(double *)
                                                        (local_ad8 + -8 + (long)pdVar48 * 8) *
                                                       dVar90 * dVar113 +
                                                       (*(double *)
                                                         ((long)local_700.p +
                                                         (long)pdVar48 * 8 + lVar38) * -4.0 +
                                                       (dVar114 - dVar99) + dVar93) *
                                                       *(double *)(local_ad8 + (long)pdVar48 * 8) *
                                                       dVar106 * dVar113) * local_648;
                      }
                      *(double *)(lVar30 + (long)pdVar48 * 8) = dVar90;
                      pdVar48 = (double *)((long)pdVar48 + 1);
                      local_a70 = lVar34;
                      local_8f8 = lVar30;
                    } while ((local_ac8.bigend.vect[0] - local_ac8.smallend.vect[0]) + 1 !=
                             (int)pdVar48);
                  }
                  local_c18 = local_c18 + 1;
                  lVar30 = lVar30 + local_a30;
                  local_a28 = local_a28 + 1;
                  local_b28 = local_b28 + local_960;
                  local_a68 = local_a68 + lVar44;
                  local_a48 = local_a48 + lVar44;
                  local_ae0 = local_ae0 + local_960;
                  local_ad8 = local_ad8 + local_960;
                  local_ad0 = local_ad0 + local_960;
                  local_b10 = local_b10 + local_960;
                  local_b88 = local_b88 + local_960;
                  local_b40 = (double *)((long)local_b40 + local_960);
                  local_b38 = local_b38 + local_960;
                  local_b08 = local_b08 + local_960;
                  local_b00 = local_b00 + local_960;
                  lVar34 = lVar34 + local_8f0;
                } while (local_ac8.bigend.vect[1] + 1U != (int)local_c18);
              }
              local_bb0 = local_bb0 + 1;
              local_968 = local_968 + local_918;
              local_9f0 = local_9f0 + 1;
              local_900 = local_900 + local_730;
              local_908 = local_908 + lVar35;
              local_880 = local_880 + lVar35;
              local_888 = local_888 + local_730;
              local_890 = local_890 + local_730;
              local_898 = local_898 + local_730;
              local_8a0 = local_8a0 + local_730;
              local_970 = local_970 + local_730;
              local_848 = local_848 + local_730;
              local_850 = local_850 + local_730;
              local_858 = local_858 + local_730;
              local_860 = local_860 + local_730;
              local_868 = local_868 + local_8b0;
            } while (local_a0c != (int)local_bb0);
          }
        }
        else {
          local_c40 = (long)local_ac8.smallend.vect[2];
          if (local_ac8.smallend.vect[2] <= local_ac8.bigend.vect[2]) {
            lVar76 = (long)local_ac8.smallend.vect[1];
            lVar41 = (long)local_ac8.smallend.vect[0];
            lVar30 = lVar76 * 8;
            local_a60 = lVar34 * 0x10;
            lVar78 = (local_a60 + local_c40 * 8 + lVar54 * -8) * lVar27;
            local_a48 = (double *)((lVar34 * 8 + local_c40 * 8 + lVar54 * -8) * lVar27);
            lVar38 = (local_c40 - lVar54) * lVar27;
            local_a68 = (double *)(ulong)(uint)~iVar50;
            lVar45 = lVar30 + lVar51 * -8;
            local_980 = (ulong)(uint)~iVar33;
            local_a70 = ((local_c40 - local_8a8) * local_a08 * 8 + lVar30 + local_a00 * -8) *
                        local_9f8 + lVar41 * 8 + local_8c0 * -8 + (long)local_360.dptr;
            local_a50 = local_a08 * local_9f8 * 8;
            local_a78 = (lVar76 * 4 + (local_c40 - local_910) * local_a38 * 4 + local_a40 * -4) *
                        local_940 + lVar41 * 4 + local_920 * -4 + (long)local_9a8;
            local_a58 = local_a38 * local_940 * 4;
            pdVar48 = pdVar22 + (lVar41 - lVar60);
            local_988 = lVar27 * 8;
            local_a18 = local_988 * lVar44;
            local_990 = CONCAT44(local_990._4_4_,~iVar50 + local_ac8.smallend.vect[1]);
            local_a98 = CONCAT44(local_a98._4_4_,~iVar33 + local_ac8.smallend.vect[2]);
            local_a80 = (lVar78 + lVar76 * 8 + lVar51 * -8) * lVar44 + lVar41 * 8 + lVar60 * -8 +
                        (long)pdVar22;
            local_a88 = (long)(local_a48 + (lVar76 - lVar51)) * lVar44 + lVar41 * 8 + lVar60 * -8 +
                        (long)pdVar22;
            local_a90 = (lVar38 * 8 + lVar30 + lVar51 * -8) * lVar44 + lVar41 * 8 + lVar60 * -8 +
                        (long)pdVar22;
            local_aa0 = (ulong)(uint)local_ac8.bigend.vect[1];
            lVar30 = lVar44 * 8;
            local_b40 = pdVar48;
            do {
              if (local_ac8.smallend.vect[1] <= local_ac8.bigend.vect[1]) {
                lVar42 = (long)(int)local_a98;
                lVar46 = (local_a60 + lVar42 * 8) * lVar27;
                lVar49 = (lVar34 * 8 + lVar42 * 8) * lVar27;
                local_c80 = (double *)((lVar45 + lVar46) * lVar44 + (long)pdVar48);
                local_c60 = (double *)((lVar49 + lVar45) * lVar44 + (long)pdVar48);
                local_c50 = (double *)((lVar45 + lVar42 * local_988) * lVar44 + (long)pdVar48);
                lVar47 = (~iVar33 + (int)local_c40) * lVar35;
                lVar31 = (local_c40 - lVar54) * lVar35;
                lVar56 = local_a80;
                lVar39 = lVar76;
                lVar40 = local_a78;
                lVar55 = local_a90;
                lVar80 = local_a70;
                lVar71 = local_a88;
                iVar24 = ~iVar50 + local_ac8.smallend.vect[1];
                do {
                  if (local_ac8.smallend.vect[0] <= local_ac8.bigend.vect[0]) {
                    lVar52 = (long)iVar24;
                    lVar57 = (~iVar50 + (int)lVar39) * lVar44;
                    lVar58 = (lVar39 - lVar51) * lVar44;
                    lVar59 = 0;
                    do {
                      dVar90 = 0.0;
                      if (*(int *)(lVar40 + lVar59 * 4) == 0) {
                        if ((int)local_728 == 0x66) {
                          dVar90 = 1.0;
                          if ((int)local_7a8 - lVar41 == lVar59) {
LAB_006784e6:
                            dVar90 = 0.0;
                          }
                        }
                        else {
                          dVar90 = 1.0;
                          if ((int)local_728 == 0x6a && (int)local_7a8 - lVar41 == lVar59)
                          goto LAB_006784e6;
                        }
                        if ((((int)local_7c0 == 0x66) || (dVar113 = 1.0, (int)local_7c0 == 0x6a)) &&
                           (dVar113 = 1.0, aiStack_79c[0] - lVar41 == lVar59)) {
                          dVar113 = 0.0;
                        }
                        if ((int)local_7b0 == 0x66) {
                          dVar106 = 1.0;
                          if (lVar39 == local_7a8._4_4_) {
LAB_0067853a:
                            dVar106 = 0.0;
                          }
                        }
                        else {
                          dVar106 = 1.0;
                          if (lVar39 == local_7a8._4_4_ && local_7b0 == 0x6a) goto LAB_0067853a;
                        }
                        if ((int)local_7b8 == 0x66) {
                          dVar107 = 1.0;
                          if (lVar39 == aiStack_79c[1]) {
LAB_00678566:
                            dVar107 = 0.0;
                          }
                        }
                        else {
                          dVar107 = 1.0;
                          if (lVar39 == aiStack_79c[1] && local_7b8 == 0x6a) goto LAB_00678566;
                        }
                        if (local_974 == Neumann) {
                          dVar97 = 1.0;
                          if (local_c40 == iStack_7a0) {
LAB_00678597:
                            dVar97 = 0.0;
                          }
                        }
                        else {
                          dVar97 = 1.0;
                          if (local_c40 == iStack_7a0 && local_974 == inflow) goto LAB_00678597;
                        }
                        dVar109 = 1.0;
                        if (local_978 == Neumann) {
                          if (local_c40 == (int)uStack_794) {
LAB_006785cd:
                            dVar109 = 0.0;
                          }
                        }
                        else if (local_c40 == (int)uStack_794 && local_978 == inflow)
                        goto LAB_006785cd;
                        lVar61 = (long)(~iVar18 + local_ac8.smallend.vect[0] + (int)lVar59);
                        pdVar77 = pdVar22 + lVar57 + lVar61 + lVar47;
                        pdVar75 = pdVar22 + lVar58 + lVar61 + lVar47;
                        pdVar1 = pdVar22 + lVar57 + lVar61 + lVar31;
                        pdVar53 = pdVar22 + lVar58 + lVar61 + lVar31;
                        dVar90 = (dVar113 * *(double *)(lVar56 + lVar59 * 8) * dVar107 +
                                 dVar90 * pdVar53[lVar36 * 2] * dVar107 +
                                 *(double *)
                                  ((long)local_b40 + lVar59 * 8 + (lVar78 + lVar52 * 8) * lVar44) *
                                 dVar113 * dVar106 +
                                 pdVar1[lVar36 * 2] * dVar90 * dVar106 +
                                 (((-pdVar77[lVar36 * 2] * dVar90 * dVar106 -
                                   *(double *)
                                    ((long)pdVar48 + lVar59 * 8 + (lVar46 + lVar52 * 8) * lVar44) *
                                   dVar113 * dVar106) - pdVar75[lVar36 * 2] * dVar90 * dVar107) -
                                 local_c80[lVar59] * dVar113 * dVar107)) * local_650 +
                                 (*(double *)(lVar55 + lVar59 * 8) * dVar107 * dVar109 +
                                 ((*(double *)
                                    ((long)local_b40 +
                                    lVar59 * 8 + (lVar38 * 8 + lVar52 * 8) * lVar44) * dVar106 *
                                   dVar109 +
                                  ((local_c50[lVar59] * dVar107 * dVar97 +
                                   ((*(double *)
                                      ((long)pdVar48 +
                                      lVar59 * 8 + (lVar42 * local_988 + lVar52 * 8) * lVar44) *
                                     dVar106 * dVar97 - *pdVar77 * dVar106 * dVar97) -
                                   *pdVar75 * dVar107 * dVar97)) - *pdVar1 * dVar106 * dVar109)) -
                                 *pdVar53 * dVar107 * dVar109)) * local_640 +
                                 (*(double *)(lVar71 + lVar59 * 8) * dVar113 * dVar109 +
                                 pdVar53[lVar36] * dVar90 * dVar109 +
                                 (((local_c60[lVar59] * dVar113 * dVar97 +
                                   pdVar75[lVar36] * dVar90 * dVar97 +
                                   (-pdVar77[lVar36] * dVar90 * dVar97 -
                                   *(double *)
                                    ((long)pdVar48 + lVar59 * 8 + (lVar49 + lVar52 * 8) * lVar44) *
                                   dVar113 * dVar97)) - pdVar1[lVar36] * dVar90 * dVar109) -
                                 *(double *)
                                  ((long)local_b40 +
                                  lVar59 * 8 + (long)(local_a48 + lVar52) * lVar44) * dVar113 *
                                 dVar109)) * local_648;
                      }
                      *(double *)(lVar80 + lVar59 * 8) = dVar90;
                      lVar59 = lVar59 + 1;
                    } while ((local_ac8.bigend.vect[0] - local_ac8.smallend.vect[0]) + 1 !=
                             (int)lVar59);
                  }
                  lVar39 = lVar39 + 1;
                  lVar80 = lVar80 + local_9f8 * 8;
                  lVar40 = lVar40 + local_940 * 4;
                  iVar24 = iVar24 + 1;
                  lVar56 = lVar56 + lVar30;
                  lVar71 = lVar71 + lVar30;
                  lVar55 = lVar55 + lVar30;
                  local_c80 = local_c80 + lVar44;
                  local_c60 = local_c60 + lVar44;
                  local_c50 = local_c50 + lVar44;
                } while (local_ac8.bigend.vect[1] + 1U != (int)lVar39);
              }
              local_c40 = local_c40 + 1;
              local_a70 = local_a70 + local_a50;
              local_a78 = local_a78 + local_a58;
              local_b40 = (double *)((long)local_b40 + local_a18);
              local_a98 = CONCAT44(local_a98._4_4_,(int)local_a98 + 1);
              local_a80 = local_a80 + local_a18;
              local_a88 = local_a88 + local_a18;
              local_a90 = local_a90 + local_a18;
            } while (local_ac8.bigend.vect[2] + 1 != (int)local_c40);
          }
        }
        if (local_668 != (FabArray<amrex::FArrayBox> *)0x0) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_6c0,local_668,&local_5d8);
          lVar34 = (long)local_9d8.smallend.vect[2];
          if (local_9d8.smallend.vect[2] <= local_9d8.bigend.vect[2]) {
            iVar24 = (int)uStack_804;
            if (local_9d8.bigend.vect[2] <= (int)uStack_804) {
              iVar24 = local_9d8.bigend.vect[2];
            }
            iVar112 = local_80c[1];
            if (local_9d8.bigend.vect[1] <= local_80c[1]) {
              iVar112 = local_9d8.bigend.vect[1];
            }
            iVar14 = local_80c[0];
            if (local_9d8.bigend.vect[0] <= local_80c[0]) {
              iVar14 = local_9d8.bigend.vect[0];
            }
            iVar15 = local_810;
            if (local_810 <= local_9d8.smallend.vect[2]) {
              iVar15 = local_9d8.smallend.vect[2];
            }
            iVar16 = local_818._4_4_;
            if (local_818._4_4_ <= local_9d8.smallend.vect[1]) {
              iVar16 = local_9d8.smallend.vect[1];
            }
            lVar30 = (long)local_9d8.smallend.vect[0];
            iVar17 = (int)local_818;
            if ((int)local_818 <= local_9d8.smallend.vect[0]) {
              iVar17 = local_9d8.smallend.vect[0];
            }
            lVar36 = ((long)local_9d8.smallend.vect[1] * 8 + (lVar34 - lVar54) * lVar27 * 8 +
                     lVar51 * -8) * lVar44 + lVar30 * 8 + lVar60 * -8 + (long)pdVar22;
            do {
              lVar76 = (long)local_9d8.smallend.vect[1];
              lVar78 = lVar36;
              if (local_9d8.smallend.vect[1] <= local_9d8.bigend.vect[1]) {
                do {
                  if (local_9d8.smallend.vect[0] <= local_9d8.bigend.vect[0]) {
                    lVar38 = 0;
                    do {
                      dVar90 = 0.0;
                      if ((((long)iVar17 <= lVar30 + lVar38) && (iVar16 <= lVar76)) &&
                         (((iVar15 <= lVar34 &&
                           ((lVar30 + lVar38 <= (long)iVar14 && (lVar76 <= iVar112)))) &&
                          (lVar34 <= iVar24)))) {
                        dVar90 = local_6c0.p
                                 [lVar30 + (((lVar76 - local_6c0.begin.y) * local_6c0.jstride +
                                            (lVar34 - local_6c0.begin.z) * local_6c0.kstride +
                                            lVar38) - (long)local_6c0.begin.x)];
                      }
                      *(double *)(lVar78 + lVar38 * 8) = dVar90;
                      lVar38 = lVar38 + 1;
                    } while ((local_9d8.bigend.vect[0] - local_9d8.smallend.vect[0]) + 1 !=
                             (int)lVar38);
                  }
                  lVar76 = lVar76 + 1;
                  lVar78 = lVar78 + lVar44 * 8;
                } while (local_9d8.bigend.vect[1] + 1 != (int)lVar76);
              }
              lVar34 = lVar34 + 1;
              lVar36 = lVar36 + lVar35 * 8;
            } while (local_9d8.bigend.vect[2] + 1 != (int)lVar34);
          }
          if ((int)local_8b8 == 1) {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_700,local_7f0,&local_5d8);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_618,&(local_7e8._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                       &local_5d8);
            local_b28 = (long)local_ac8.smallend.vect[2];
            if (local_ac8.smallend.vect[2] <= local_ac8.bigend.vect[2]) {
              local_a50 = (ulong)(uint)local_ac8.bigend.vect[1];
              local_a58 = (long)local_ac8.smallend.vect[1];
              lVar45 = (long)local_ac8.smallend.vect[0];
              lVar34 = local_a58 * 8;
              local_a18 = local_a08 * local_9f8 * 8;
              local_aa0 = local_a38 * local_940 * 4;
              local_ae8 = local_b28 + -1;
              lVar38 = lVar34 + (local_ae8 - lVar54) * lVar27 * 8 + lVar51 * -8;
              lVar78 = lVar34 + (local_b28 - lVar54) * lVar27 * 8 + lVar51 * -8;
              local_a68 = (double *)(lVar45 * 8);
              lVar30 = lVar35 * 8;
              local_a48 = (double *)(lVar44 * 8);
              lVar36 = (lVar38 + -8) * lVar44 + lVar45 * 8 + lVar60 * -8 + (long)pdVar22;
              lVar76 = lVar78 * lVar44 + lVar45 * 8 + lVar60 * -8 + (long)pdVar22;
              lVar78 = (lVar78 + -8) * lVar44 + lVar45 * 8 + lVar60 * -8 + (long)pdVar22;
              lVar38 = lVar38 * lVar44 + lVar45 * 8 + lVar60 * -8 + (long)pdVar22;
              lVar34 = (lVar34 + (local_b28 - local_8a8) * local_a08 * 8 + local_a00 * -8) *
                       local_9f8 + lVar45 * 8 + local_8c0 * -8 + (long)local_948;
              lVar41 = (local_a58 * 4 + (local_b28 - local_910) * local_a38 * 4 + local_a40 * -4) *
                       local_940 + lVar45 * 4 + local_920 * -4 + (long)local_9a8;
              do {
                local_a78 = lVar41;
                local_a70 = lVar34;
                local_a80 = lVar38;
                local_a98 = lVar78;
                local_a88 = lVar76;
                local_a90 = lVar36;
                lVar34 = local_a70;
                lVar36 = local_a78;
                local_c80 = (double *)local_a98;
                local_c60 = (double *)local_a90;
                local_c50 = (double *)local_a88;
                local_c48 = local_a80;
                local_b40 = (double *)(local_a58 + -1);
                local_b38 = local_a58;
                if (local_ac8.smallend.vect[1] <= local_ac8.bigend.vect[1]) {
                  do {
                    if (local_ac8.smallend.vect[0] <= local_ac8.bigend.vect[0]) {
                      lVar78 = (long)local_700.begin.x;
                      pdVar48 = local_700.p + lVar45;
                      lVar76 = (local_ae8 - local_700.begin.z) * local_700.kstride * 8;
                      lVar38 = (local_b38 - local_700.begin.y) * local_700.jstride * 8;
                      lVar73 = lVar76 + lVar38 + lVar78 * -8;
                      lVar41 = (local_b28 - local_700.begin.z) * local_700.kstride * 8;
                      lVar61 = lVar38 + lVar41 + lVar78 * -8;
                      lVar38 = ((long)local_b40 - (long)local_700.begin.y) * local_700.jstride * 8;
                      lVar39 = lVar76 + lVar38 + lVar78 * -8;
                      lVar62 = lVar38 + lVar41 + lVar78 * -8;
                      lVar55 = (local_ae8 - local_618.begin.z) * local_618.kstride * 8;
                      lVar71 = (local_b38 - local_618.begin.y) * local_618.jstride * 8;
                      lVar76 = lVar71 + lVar55;
                      lVar47 = local_618.nstride * 0x38;
                      lVar78 = (local_b28 - local_618.begin.z) * local_618.kstride * 8;
                      lVar71 = lVar71 + lVar78;
                      lVar79 = ((long)local_b40 - (long)local_618.begin.y) * local_618.jstride * 8;
                      lVar55 = lVar55 + lVar79;
                      lVar79 = lVar79 + lVar78;
                      lVar52 = local_618.nstride * 0x10;
                      lVar72 = (long)local_618.begin.x;
                      lVar41 = local_618.nstride * 0x90;
                      lVar57 = lVar76 + lVar41 + lVar72 * -8;
                      lVar40 = local_618.nstride * 0x40;
                      lVar49 = lVar76 + lVar40 + lVar72 * -8;
                      lVar58 = lVar76 + lVar47 + lVar72 * -8;
                      lVar56 = local_618.nstride * 0x30;
                      lVar63 = lVar76 + lVar56 + lVar72 * -8;
                      lVar64 = lVar76 + lVar52 + lVar72 * -8;
                      lVar78 = lVar76 + local_618.nstride * 8 + lVar72 * -8;
                      lVar76 = lVar76 + lVar72 * -8;
                      lVar65 = lVar71 + lVar41 + lVar72 * -8;
                      lVar66 = lVar71 + lVar40 + lVar72 * -8;
                      lVar67 = lVar71 + lVar47 + lVar72 * -8;
                      lVar68 = lVar71 + lVar56 + lVar72 * -8;
                      lVar69 = lVar71 + lVar52 + lVar72 * -8;
                      lVar81 = lVar71 + local_618.nstride * 8 + lVar72 * -8;
                      lVar71 = lVar71 + lVar72 * -8;
                      lVar31 = lVar55 + lVar41 + lVar72 * -8;
                      lVar74 = lVar55 + lVar40 + lVar72 * -8;
                      lVar70 = lVar55 + lVar47 + lVar72 * -8;
                      lVar46 = lVar55 + lVar56 + lVar72 * -8;
                      lVar80 = lVar55 + lVar52 + lVar72 * -8;
                      lVar38 = lVar55 + local_618.nstride * 8 + lVar72 * -8;
                      lVar55 = lVar55 + lVar72 * -8;
                      lVar42 = lVar41 + lVar79 + lVar72 * -8;
                      lVar40 = lVar40 + lVar79 + lVar72 * -8;
                      lVar47 = lVar47 + lVar79 + lVar72 * -8;
                      lVar59 = lVar56 + lVar79 + lVar72 * -8;
                      lVar56 = lVar52 + lVar79 + lVar72 * -8;
                      lVar41 = lVar79 + local_618.nstride * 8 + lVar72 * -8;
                      lVar79 = lVar79 + lVar72 * -8;
                      pdVar75 = local_618.p + lVar45;
                      lVar52 = 0;
                      do {
                        dVar90 = 0.0;
                        if (*(int *)(lVar36 + lVar52 * 4) == 0) {
                          uVar103 = (ulong)DAT_0074fb00;
                          dVar90 = ((*(double *)((long)pdVar75 + lVar52 * 8 + lVar46 + -8) +
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar70 + -8) +
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar74 + -8)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar39 + -8) * 0.125 +
                                    (*(double *)((long)pdVar75 + lVar52 * 8 + lVar55 + -8) +
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar38 + -8) +
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar80 + -8)) * 0.25 +
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar31 + -8)) *
                                   *(double *)((long)local_c60 + -8 + lVar52 * 8) +
                                   (((((double)(*(ulong *)((long)pdVar75 + lVar52 * 8 + lVar46) ^
                                               uVar103) -
                                      *(double *)((long)pdVar75 + lVar52 * 8 + lVar70)) +
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar74)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar39) * 0.125 +
                                    ((*(double *)((long)pdVar75 + lVar52 * 8 + lVar38) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar55)) +
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar80)) * 0.25) -
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar31)) *
                                   *(double *)((long)local_c60 + lVar52 * 8) +
                                   ((((*(double *)((long)pdVar75 + lVar52 * 8 + lVar58 + -8) -
                                      *(double *)((long)pdVar75 + lVar52 * 8 + lVar63 + -8)) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar49 + -8)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar73 + -8) * 0.125 +
                                    ((*(double *)((long)pdVar75 + lVar52 * 8 + lVar76 + -8) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar78 + -8)) +
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar64 + -8)) * 0.25) -
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar57 + -8)) *
                                   *(double *)(local_c48 + -8 + lVar52 * 8) +
                                   (((*(double *)((long)pdVar75 + lVar52 * 8 + lVar63) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar58)) -
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar49)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar73) * 0.125 +
                                    (((double)(*(ulong *)((long)pdVar75 + lVar52 * 8 + lVar76) ^
                                              uVar103) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar78)) +
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar64)) * 0.25 +
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar57)) *
                                   *(double *)(local_c48 + lVar52 * 8) +
                                   ((((*(double *)((long)pdVar75 + lVar52 * 8 + lVar59 + -8) -
                                      *(double *)((long)pdVar75 + lVar52 * 8 + lVar47 + -8)) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar40 + -8)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar62 + -8) * 0.125 +
                                    ((*(double *)((long)pdVar75 + lVar52 * 8 + lVar79 + -8) +
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar41 + -8)) -
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar56 + -8)) * 0.25) -
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar42 + -8)) *
                                   *(double *)((long)local_c80 + -8 + lVar52 * 8) +
                                   (((*(double *)((long)pdVar75 + lVar52 * 8 + lVar47) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar59)) -
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar40)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar62) * 0.125 +
                                    ((*(double *)((long)pdVar75 + lVar52 * 8 + lVar41) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar79)) -
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar56)) * 0.25 +
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar42)) *
                                   *(double *)((long)local_c80 + lVar52 * 8) +
                                   (((*(double *)((long)pdVar75 + lVar52 * 8 + lVar68) +
                                      *(double *)((long)pdVar75 + lVar52 * 8 + lVar67) +
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar66)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar61) * 0.125 +
                                    (((double)(*(ulong *)((long)pdVar75 + lVar52 * 8 + lVar71) ^
                                              uVar103) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar81)) -
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar69)) * 0.25) -
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar65)) *
                                   *(double *)((long)local_c50 + lVar52 * 8) +
                                   ((((double)(*(ulong *)((long)pdVar75 + lVar52 * 8 + lVar68 + -8)
                                              ^ uVar103) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar67 + -8)) +
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar66 + -8)) * 0.5 +
                                    *(double *)((long)pdVar48 + lVar52 * 8 + lVar61 + -8) * 0.125 +
                                    ((*(double *)((long)pdVar75 + lVar52 * 8 + lVar71 + -8) -
                                     *(double *)((long)pdVar75 + lVar52 * 8 + lVar81 + -8)) -
                                    *(double *)((long)pdVar75 + lVar52 * 8 + lVar69 + -8)) * 0.25 +
                                   *(double *)((long)pdVar75 + lVar52 * 8 + lVar65 + -8)) *
                                   *(double *)((long)local_c50 + -8 + lVar52 * 8);
                        }
                        *(double *)(lVar34 + lVar52 * 8) = dVar90 + *(double *)(lVar34 + lVar52 * 8)
                        ;
                        lVar52 = lVar52 + 1;
                      } while ((local_ac8.bigend.vect[0] - local_ac8.smallend.vect[0]) + 1 !=
                               (int)lVar52);
                    }
                    local_b38 = local_b38 + 1;
                    lVar34 = lVar34 + local_9f8 * 8;
                    lVar36 = lVar36 + local_940 * 4;
                    local_c48 = local_c48 + (long)local_a48;
                    local_c50 = (double *)((long)local_c50 + (long)local_a48);
                    local_c60 = (double *)((long)local_c60 + (long)local_a48);
                    local_c80 = (double *)((long)local_c80 + (long)local_a48);
                    local_b40 = (double *)((long)local_b40 + 1);
                  } while (local_ac8.bigend.vect[1] + 1U != (int)local_b38);
                }
                local_b28 = local_b28 + 1;
                local_ae8 = local_ae8 + 1;
                lVar36 = local_a90 + lVar30;
                lVar76 = local_a88 + lVar30;
                lVar78 = local_a98 + lVar30;
                lVar38 = local_a80 + lVar30;
                lVar34 = local_a70 + local_a18;
                lVar41 = local_a78 + local_aa0;
              } while (local_ac8.bigend.vect[2] + 1 != (int)local_b28);
            }
          }
          else {
            local_c58 = (long)local_ac8.smallend.vect[2];
            if (local_ac8.smallend.vect[2] <= local_ac8.bigend.vect[2]) {
              lVar78 = (long)local_ac8.smallend.vect[1];
              lVar36 = (long)local_ac8.smallend.vect[0];
              lVar34 = lVar78 * 8;
              local_c40 = ((local_c58 - local_8a8) * local_a08 * 8 + lVar34 + local_a00 * -8) *
                          local_9f8 + lVar36 * 8 + local_8c0 * -8 + (long)local_948;
              local_c20 = (lVar78 * 4 + (local_c58 - local_910) * local_a38 * 4 + local_a40 * -4) *
                          local_940 + lVar36 * 4 + local_920 * -4 + (long)local_9a8;
              pdVar48 = pdVar22 + (lVar36 - lVar60);
              lVar76 = (local_c58 - lVar54) * lVar27;
              lVar30 = lVar27 * 8 * lVar44;
              iVar24 = ~iVar33 + local_ac8.smallend.vect[2];
              local_c30 = (lVar76 * 8 + lVar34 + lVar51 * -8) * lVar44 + lVar36 * 8 + lVar60 * -8 +
                          (long)pdVar22;
              local_c28 = pdVar48;
              do {
                if (local_ac8.smallend.vect[1] <= local_ac8.bigend.vect[1]) {
                  lVar56 = (long)iVar24 * lVar27 * 8;
                  pdVar75 = (double *)((lVar34 + lVar51 * -8 + lVar56) * lVar44 + (long)pdVar48);
                  lVar39 = (~iVar33 + (int)local_c58) * lVar35;
                  lVar40 = (local_c58 - lVar54) * lVar35;
                  lVar36 = local_c40;
                  lVar38 = local_c20;
                  lVar41 = local_c30;
                  lVar45 = lVar78;
                  iVar112 = ~iVar50 + local_ac8.smallend.vect[1];
                  do {
                    if (local_ac8.smallend.vect[0] <= local_ac8.bigend.vect[0]) {
                      lVar55 = ((int)lVar45 + ~iVar50) * lVar44;
                      lVar80 = (lVar45 - lVar51) * lVar44;
                      lVar71 = 0;
                      do {
                        dVar90 = 0.0;
                        if (*(int *)(lVar38 + lVar71 * 4) == 0) {
                          lVar31 = (long)(~iVar18 + local_ac8.smallend.vect[0] + (int)lVar71);
                          dVar90 = (pdVar22[lVar55 + lVar31 + lVar39] +
                                    *(double *)
                                     ((long)pdVar48 +
                                     lVar71 * 8 + (lVar56 + (long)iVar112 * 8) * lVar44) +
                                    pdVar22[lVar80 + lVar31 + lVar39] + pdVar75[lVar71] +
                                    pdVar22[lVar55 + lVar31 + lVar40] +
                                    *(double *)
                                     ((long)local_c28 +
                                     lVar71 * 8 + (lVar76 * 8 + (long)iVar112 * 8) * lVar44) +
                                    pdVar22[lVar80 + lVar31 + lVar40] +
                                   *(double *)(lVar41 + lVar71 * 8)) * 0.125;
                        }
                        *(double *)(lVar36 + lVar71 * 8) = dVar90 + *(double *)(lVar36 + lVar71 * 8)
                        ;
                        lVar71 = lVar71 + 1;
                      } while ((local_ac8.bigend.vect[0] - local_ac8.smallend.vect[0]) + 1 !=
                               (int)lVar71);
                    }
                    lVar45 = lVar45 + 1;
                    lVar36 = lVar36 + local_9f8 * 8;
                    lVar38 = lVar38 + local_940 * 4;
                    iVar112 = iVar112 + 1;
                    lVar41 = lVar41 + lVar44 * 8;
                    pdVar75 = pdVar75 + lVar44;
                  } while (local_ac8.bigend.vect[1] + 1U != (int)lVar45);
                }
                local_c58 = local_c58 + 1;
                local_c40 = local_c40 + local_a08 * local_9f8 * 8;
                local_c20 = local_c20 + local_a38 * local_940 * 4;
                local_c28 = (double *)((long)local_c28 + lVar30);
                iVar24 = iVar24 + 1;
                local_c30 = local_c30 + lVar30;
              } while (local_ac8.bigend.vect[2] + 1 != (int)local_c58);
            }
          }
        }
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_6c0,local_670,&local_5d8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_700,local_538,&local_5d8);
        if ((int)local_8b8 == 1) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_618,(FabArray<amrex::FArrayBox> *)*local_678,&local_5d8);
          local_754 = local_ac8.bigend.vect[2];
          iStack_75c = local_ac8.bigend.vect[0];
          local_758 = local_ac8.bigend.vect[1];
          local_768 = (EBCellFlag *)
                      CONCAT44(local_ac8.smallend.vect[1] + -1,local_ac8.smallend.vect[0] + -1);
          iStack_760 = local_ac8.smallend.vect[2] + -1;
          local_578.kstride._0_4_ = local_ac8.bigend.vect[1];
          local_578.kstride._4_4_ = local_ac8.bigend.vect[2];
          local_578.p = local_768;
          local_578.jstride._0_4_ = iStack_760;
          local_578.jstride._4_4_ = local_ac8.bigend.vect[0];
          lVar27 = 0;
          do {
            if ((local_ac8.btype.itype >> ((uint)lVar27 & 0x1f) & 1) != 0) {
              piVar28 = (int *)((long)&local_578.jstride + lVar27 * 4 + 4);
              *piVar28 = *piVar28 + -1;
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != 3);
          local_578.nstride._0_4_ = 0;
          local_788.btype.itype = 0;
          local_788.smallend.vect[2] = local_ac8.smallend.vect[2] + -2;
          local_788.bigend.vect[0] = local_578.jstride._4_4_ + 1;
          local_788.smallend.vect[1] = local_ac8.smallend.vect[1] + -2;
          local_788.smallend.vect[0] = local_ac8.smallend.vect[0] + -2;
          local_788.bigend.vect[1] = (uint)local_578.kstride + 1;
          local_788.bigend.vect[2] = local_578.kstride._4_4_ + 1;
          FArrayBox::resize((FArrayBox *)&local_438,(Box *)&local_768,9,(Arena *)0x0);
          DVar29.m_arena = local_438.super_DataAllocator.m_arena;
          if (local_438.super_DataAllocator.m_arena == (Arena *)0x0) {
            DVar29.m_arena = The_Arena();
          }
          Gpu::Elixir::Elixir(&local_178,(void *)0x0,DVar29.m_arena);
          iVar24 = local_438.domain.bigend.vect[2];
          iVar33 = local_438.domain.bigend.vect[1];
          iVar50 = local_438.domain.bigend.vect[0];
          iVar18 = local_438.domain.smallend.vect[0];
          pdVar22 = local_438.dptr;
          lVar27 = (long)local_438.domain.smallend.vect[0];
          local_870 = (ulong)local_438.domain.smallend.vect[1];
          local_7d0 = (long)local_438.domain.smallend.vect[2];
          FArrayBox::resize((FArrayBox *)&local_480,&local_788,0x1c,(Arena *)0x0);
          DVar29.m_arena = local_480.super_DataAllocator.m_arena;
          if (local_480.super_DataAllocator.m_arena == (Arena *)0x0) {
            DVar29.m_arena = The_Arena();
          }
          lVar51 = (long)((iVar50 - iVar18) + 1);
          local_740 = (long)((iVar33 - (int)local_870) + 1);
          local_7d8 = (long)((iVar24 - (int)local_7d0) + 1);
          Gpu::Elixir::Elixir(&local_60,(void *)0x0,DVar29.m_arena);
          iVar18 = local_480.domain.smallend.vect[0];
          local_9a0 = local_480.dptr;
          lVar44 = (long)local_480.domain.smallend.vect[0];
          local_a60 = (long)local_480.domain.smallend.vect[1];
          local_918 = (long)local_480.domain.smallend.vect[2];
          lVar54 = (long)((local_480.domain.bigend.vect[0] - local_480.domain.smallend.vect[0]) + 1)
          ;
          local_7e0 = (long)((local_480.domain.bigend.vect[1] - local_480.domain.smallend.vect[1]) +
                            1);
          local_970 = (long)((local_480.domain.bigend.vect[2] - local_480.domain.smallend.vect[2]) +
                            1);
          local_8b0 = local_7e0 * lVar54;
          lVar60 = local_970 * local_8b0;
          local_938 = lVar60 * 0xd8;
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_578,local_748,&local_5d8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_118,local_7f0,&local_5d8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1b8,&(local_7e8._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                     &local_5d8);
          BATransformer::operator()
                    (&local_98,&((local_5d8.fabArray)->boxarray).m_bat,
                     (Box *)((long)((local_5d8.index_map)->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[local_5d8.currentIndex] * 0x1c +
                            *(long *)&((((local_5d8.fabArray)->boxarray).m_ref.
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          auVar20 = _DAT_00778a00;
          auVar19 = _DAT_0074fb40;
          local_62c[1] = local_98.bigend.vect[1];
          local_62c[2] = local_98.bigend.vect[2];
          local_62c[3] = local_98.btype.itype;
          local_638 = local_98.smallend.vect[0];
          local_634 = local_98.smallend.vect[1];
          uVar21 = _local_638;
          local_62c[0] = local_98.bigend.vect[0];
          lVar34 = 0;
          do {
            if (((uint)local_62c[3] >> ((uint)lVar34 & 0x1f) & 1) != 0) {
              local_62c[lVar34] = local_62c[lVar34] + -1;
            }
            lVar34 = lVar34 + 1;
          } while (lVar34 != 3);
          local_938 = local_938 + (long)local_9a0;
          lVar34 = (long)local_788.smallend.vect[2];
          if (local_788.smallend.vect[2] <= local_788.bigend.vect[2]) {
            lVar30 = (long)local_788.smallend.vect[0];
            local_9f0 = (long)local_788.smallend.vect[1];
            local_958 = (ulong)(uint)local_788.bigend.vect[1];
            iVar50 = local_62c[2];
            if (local_788.bigend.vect[2] < local_62c[2]) {
              iVar50 = local_788.bigend.vect[2];
            }
            uVar26 = local_62c[1];
            if (local_788.bigend.vect[1] < local_62c[1]) {
              uVar26 = local_788.bigend.vect[1];
            }
            if (local_788.bigend.vect[0] < local_62c[0]) {
              local_62c[0] = local_788.bigend.vect[0];
            }
            iVar33 = local_98.smallend.vect[2];
            if (local_98.smallend.vect[2] < local_788.smallend.vect[2]) {
              iVar33 = local_788.smallend.vect[2];
            }
            local_634 = local_98.smallend.vect[1];
            if (local_634 < local_788.smallend.vect[1]) {
              local_634 = local_788.smallend.vect[1];
            }
            local_638 = local_98.smallend.vect[0];
            if (local_638 < local_788.smallend.vect[0]) {
              local_638 = local_788.smallend.vect[0];
            }
            lVar35 = lVar60 * 0x10;
            local_a78 = lVar60 * 0x20;
            local_a80 = lVar60 * 0x40;
            local_a88 = lVar60 * 0x18;
            local_a90 = lVar60 * 0x28;
            local_a98 = lVar60 * 0x48;
            local_8e8 = CONCAT44(local_8e8._4_4_,local_788.bigend.vect[2] + 1);
            local_9b0 = ((local_970 * 8 + lVar34 * 8 + local_918 * -8) * local_7e0 + local_9f0 * 8 +
                        local_a60 * -8) * lVar54 + lVar30 * 8 + lVar44 * -8 + (long)local_9a0;
            local_950 = (local_9f0 * 8 + (lVar34 - local_918) * local_7e0 * 8 + local_a60 * -8) *
                        lVar54 + lVar30 * 8 + lVar44 * -8 + (long)local_9a0;
            local_a50 = lVar60 * 0x30;
            local_a58 = lVar60 * 0x38;
            local_a18 = lVar60 * 0x50;
            local_aa0 = lVar60 * 0x58;
            local_980 = lVar60 * 0x68;
            local_988 = lVar60 * 0x70;
            local_990 = lVar60 * 0x78;
            local_8c8 = lVar60 * 0x88;
            local_8d0 = lVar60 * 0x90;
            local_998 = (double *)(lVar60 * 0x98);
            local_a20 = (double *)(lVar60 * 0xa0);
            local_928 = lVar60 * 0xa8;
            local_930 = lVar60 * 0xb0;
            local_8d8 = lVar60 * 0xb8;
            local_8e0 = lVar60 * 0xc0;
            local_9e0 = lVar60 * 200;
            local_9e8 = lVar60 * 0xd0;
            local_a70 = lVar54 * 8;
            auVar108 = _DAT_0074fb30;
            do {
              if (local_788.smallend.vect[1] <= local_788.bigend.vect[1]) {
                lVar36 = (lVar34 - local_918) * local_8b0;
                local_a28 = local_938 + lVar36 * 8;
                local_b40 = (double *)local_950;
                local_b88 = local_9b0;
                local_c70 = local_9f0;
                do {
                  if (local_788.smallend.vect[0] <= local_788.bigend.vect[0]) {
                    lVar38 = (local_c70 - local_a60) * lVar54;
                    lVar41 = (local_c70 - local_118.begin.y) * local_118.jstride;
                    lVar45 = (lVar34 - local_118.begin.z) * local_118.kstride;
                    lVar56 = (local_c70 - local_1b8.begin.y) * local_1b8.jstride;
                    lVar39 = (lVar34 - local_1b8.begin.z) * local_1b8.kstride;
                    local_a48 = (double *)(long)local_1b8.begin.x;
                    local_a68 = (double *)(local_1b8.nstride * 0x88);
                    pdVar48 = local_b40;
                    lVar76 = local_b88;
                    lVar78 = lVar30;
                    do {
                      iVar24 = auVar20._0_4_;
                      iVar112 = auVar20._4_4_;
                      if ((((lVar78 < local_638) || (local_c70 < local_634)) || (lVar34 < iVar33))
                         || (((local_62c[0] < lVar78 || ((int)uVar26 < local_c70)) ||
                             (iVar50 < lVar34)))) {
                        lVar80 = lVar78 - lVar44;
                        lVar40 = 0x1c;
                        lVar55 = 0;
                        auVar101 = auVar108;
                        do {
                          if (SUB164(auVar101 ^ auVar19,4) == iVar112 &&
                              SUB164(auVar101 ^ auVar19,0) < iVar24) {
                            *(undefined8 *)((long)pdVar48 + lVar55) = 0;
                            *(undefined8 *)(lVar76 + lVar55) = 0;
                          }
                          lVar71 = auVar101._8_8_;
                          auVar101._0_8_ = auVar101._0_8_ + 2;
                          auVar101._8_8_ = lVar71 + 2;
                          lVar55 = lVar55 + lVar35;
                          lVar40 = lVar40 + -2;
                        } while (lVar40 != 0);
                        dVar90 = 0.0;
                      }
                      else {
                        uVar25 = local_578.p
                                 [(local_c70 - local_578.begin.y) *
                                  CONCAT44(local_578.jstride._4_4_,(int)local_578.jstride) +
                                  (lVar34 - local_578.begin.z) *
                                  CONCAT44(local_578.kstride._4_4_,(uint)local_578.kstride) +
                                  (lVar78 - local_578.begin.x)].flag & 3;
                        if (uVar25 == 0) {
LAB_0067b3b5:
                          lVar80 = lVar78 - lVar44;
                          lVar40 = 0x1c;
                          lVar55 = 0;
                          auVar102 = auVar108;
                          do {
                            if (SUB164(auVar102 ^ auVar19,4) == iVar112 &&
                                SUB164(auVar102 ^ auVar19,0) < iVar24) {
                              *(undefined8 *)((long)pdVar48 + lVar55) = 0x3ff0000000000000;
                              *(undefined8 *)(lVar76 + lVar55) = 0x3ff0000000000000;
                            }
                            lVar71 = auVar102._8_8_;
                            auVar102._0_8_ = auVar102._0_8_ + 2;
                            auVar102._8_8_ = lVar71 + 2;
                            lVar55 = lVar55 + lVar35;
                            lVar40 = lVar40 + -2;
                          } while (lVar40 != 0);
                        }
                        else if (uVar25 == 3) {
                          lVar80 = lVar78 - lVar44;
                          lVar40 = 0x1c;
                          lVar55 = 0;
                          auVar100 = auVar108;
                          do {
                            if (SUB164(auVar100 ^ auVar19,4) == iVar112 &&
                                SUB164(auVar100 ^ auVar19,0) < iVar24) {
                              *(undefined8 *)((long)pdVar48 + lVar55) = 0;
                              *(undefined8 *)(lVar76 + lVar55) = 0;
                            }
                            lVar71 = auVar100._8_8_;
                            auVar100._0_8_ = auVar100._0_8_ + 2;
                            auVar100._8_8_ = lVar71 + 2;
                            lVar55 = lVar55 + lVar35;
                            lVar40 = lVar40 + -2;
                          } while (lVar40 != 0);
                        }
                        else {
                          lVar40 = lVar78 - local_118.begin.x;
                          if (0.9999999999999778 <= local_118.p[lVar41 + lVar45 + lVar40])
                          goto LAB_0067b3b5;
                          lVar55 = lVar78 - (long)local_a48;
                          pdVar75 = local_1b8.p + lVar56 + lVar39 + lVar55;
                          uVar103 = (ulong)DAT_0074fb00;
                          lVar80 = lVar78 - lVar44;
                          local_9a0[lVar36 + lVar38 + lVar80] =
                               (((pdVar75[local_1b8.nstride * 6] - pdVar75[local_1b8.nstride * 9]) -
                                pdVar75[local_1b8.nstride * 0xb]) + pdVar75[local_1b8.nstride * 0xf]
                               ) * 9.0 + local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                                         (((double)((ulong)local_1b8.p[lVar56 + lVar39 + lVar55] ^
                                                   uVar103) - pdVar75[local_1b8.nstride]) +
                                          pdVar75[local_1b8.nstride * 3] +
                                         pdVar75[local_1b8.nstride * 4]) * 2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60] =
                               (pdVar75[local_1b8.nstride * 0xb] - pdVar75[local_1b8.nstride * 0xf])
                               * 18.0 + local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                                        ((pdVar75[local_1b8.nstride * 3] -
                                         local_1b8.p[lVar56 + lVar39 + lVar55]) -
                                        pdVar75[local_1b8.nstride * 4]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 2] =
                               (((pdVar75[local_1b8.nstride * 9] - pdVar75[local_1b8.nstride * 6]) -
                                pdVar75[local_1b8.nstride * 0xb]) + pdVar75[local_1b8.nstride * 0xf]
                               ) * 9.0 + local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                                         ((pdVar75[local_1b8.nstride] -
                                          local_1b8.p[lVar56 + lVar39 + lVar55]) +
                                          pdVar75[local_1b8.nstride * 3] +
                                         pdVar75[local_1b8.nstride * 4]) * 2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 3] =
                               (pdVar75[local_1b8.nstride * 9] - pdVar75[local_1b8.nstride * 0xf]) *
                               18.0 + local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                                      (((double)((ulong)pdVar75[local_1b8.nstride] ^ uVar103) -
                                       pdVar75[local_1b8.nstride * 3]) +
                                      pdVar75[local_1b8.nstride * 4]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 4] =
                               pdVar75[local_1b8.nstride * 0xf] * 36.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 2.25 +
                               ((double)((ulong)pdVar75[local_1b8.nstride * 3] ^ uVar103) -
                               pdVar75[local_1b8.nstride * 4]) * 9.0;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 5] =
                               ((double)((ulong)pdVar75[local_1b8.nstride * 9] ^ uVar103) -
                               pdVar75[local_1b8.nstride * 0xf]) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((pdVar75[local_1b8.nstride] - pdVar75[local_1b8.nstride * 3]) +
                               pdVar75[local_1b8.nstride * 4]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 6] =
                               (((double)((ulong)pdVar75[local_1b8.nstride * 6] ^ uVar103) -
                                pdVar75[local_1b8.nstride * 9]) + pdVar75[local_1b8.nstride * 0xb] +
                               pdVar75[local_1b8.nstride * 0xf]) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               ((local_1b8.p[lVar56 + lVar39 + lVar55] - pdVar75[local_1b8.nstride])
                                + pdVar75[local_1b8.nstride * 3] + pdVar75[local_1b8.nstride * 4]) *
                               2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 7] =
                               ((double)((ulong)pdVar75[local_1b8.nstride * 0xb] ^ uVar103) -
                               pdVar75[local_1b8.nstride * 0xf]) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((local_1b8.p[lVar56 + lVar39 + lVar55] +
                                pdVar75[local_1b8.nstride * 3]) - pdVar75[local_1b8.nstride * 4]) *
                               4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 8] =
                               (pdVar75[local_1b8.nstride * 6] + pdVar75[local_1b8.nstride * 9] +
                                pdVar75[local_1b8.nstride * 0xb] + pdVar75[local_1b8.nstride * 0xf])
                               * 9.0 + local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                                       (local_1b8.p[lVar56 + lVar39 + lVar55] +
                                        pdVar75[local_1b8.nstride] + pdVar75[local_1b8.nstride * 3]
                                       + pdVar75[local_1b8.nstride * 4]) * 2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 9] =
                               (((pdVar75[local_1b8.nstride * 7] - pdVar75[local_1b8.nstride * 10])
                                - pdVar75[local_1b8.nstride * 0xd]) +
                               pdVar75[local_1b8.nstride * 0x10]) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               (((double)((ulong)local_1b8.p[lVar56 + lVar39 + lVar55] ^ uVar103) -
                                pdVar75[local_1b8.nstride * 2]) + pdVar75[local_1b8.nstride * 3] +
                               pdVar75[local_1b8.nstride * 5]) * 2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 10] =
                               (pdVar75[local_1b8.nstride * 0xd] - pdVar75[local_1b8.nstride * 0x10]
                               ) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((pdVar75[local_1b8.nstride * 3] -
                                local_1b8.p[lVar56 + lVar39 + lVar55]) -
                               pdVar75[local_1b8.nstride * 5]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0xb] =
                               (((pdVar75[local_1b8.nstride * 10] - pdVar75[local_1b8.nstride * 7])
                                - pdVar75[local_1b8.nstride * 0xd]) +
                               pdVar75[local_1b8.nstride * 0x10]) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               ((pdVar75[local_1b8.nstride * 2] -
                                local_1b8.p[lVar56 + lVar39 + lVar55]) +
                                pdVar75[local_1b8.nstride * 3] + pdVar75[local_1b8.nstride * 5]) *
                               2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0xc] =
                               (pdVar75[local_1b8.nstride * 10] - pdVar75[local_1b8.nstride * 0x10])
                               * 18.0 + local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                                        (((double)((ulong)pdVar75[local_1b8.nstride * 2] ^ uVar103)
                                         - pdVar75[local_1b8.nstride * 3]) +
                                        pdVar75[local_1b8.nstride * 5]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0xd] =
                               pdVar75[local_1b8.nstride * 0x10] * 36.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 2.25 +
                               ((double)((ulong)pdVar75[local_1b8.nstride * 3] ^ uVar103) -
                               pdVar75[local_1b8.nstride * 5]) * 9.0;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0xe] =
                               ((double)((ulong)pdVar75[local_1b8.nstride * 10] ^ uVar103) -
                               pdVar75[local_1b8.nstride * 0x10]) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((pdVar75[local_1b8.nstride * 2] - pdVar75[local_1b8.nstride * 3]) +
                               pdVar75[local_1b8.nstride * 5]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0xf] =
                               (((double)((ulong)pdVar75[local_1b8.nstride * 7] ^ uVar103) -
                                pdVar75[local_1b8.nstride * 10]) + pdVar75[local_1b8.nstride * 0xd]
                               + pdVar75[local_1b8.nstride * 0x10]) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               ((local_1b8.p[lVar56 + lVar39 + lVar55] -
                                pdVar75[local_1b8.nstride * 2]) + pdVar75[local_1b8.nstride * 3] +
                               pdVar75[local_1b8.nstride * 5]) * 2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x10] =
                               ((double)((ulong)pdVar75[local_1b8.nstride * 0xd] ^ uVar103) -
                               pdVar75[local_1b8.nstride * 0x10]) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((local_1b8.p[lVar56 + lVar39 + lVar55] +
                                pdVar75[local_1b8.nstride * 3]) - pdVar75[local_1b8.nstride * 5]) *
                               4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x11] =
                               (pdVar75[local_1b8.nstride * 7] + pdVar75[local_1b8.nstride * 10] +
                                pdVar75[local_1b8.nstride * 0xd] + pdVar75[local_1b8.nstride * 0x10]
                               ) * 9.0 + local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                                         (local_1b8.p[lVar56 + lVar39 + lVar55] +
                                          pdVar75[local_1b8.nstride * 2] +
                                          pdVar75[local_1b8.nstride * 3] +
                                         pdVar75[local_1b8.nstride * 5]) * 2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x12] =
                               (((pdVar75[local_1b8.nstride * 8] - pdVar75[local_1b8.nstride * 0xc])
                                - pdVar75[local_1b8.nstride * 0xe]) +
                               *(double *)((long)local_a68 + (long)pdVar75)) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               (((double)((ulong)pdVar75[local_1b8.nstride] ^ uVar103) -
                                pdVar75[local_1b8.nstride * 2]) + pdVar75[local_1b8.nstride * 4] +
                               pdVar75[local_1b8.nstride * 5]) * 2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x13] =
                               (pdVar75[local_1b8.nstride * 0xe] -
                               *(double *)((long)local_a68 + (long)pdVar75)) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((pdVar75[local_1b8.nstride * 4] - pdVar75[local_1b8.nstride]) -
                               pdVar75[local_1b8.nstride * 5]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x14] =
                               (((pdVar75[local_1b8.nstride * 0xc] - pdVar75[local_1b8.nstride * 8])
                                - pdVar75[local_1b8.nstride * 0xe]) +
                               *(double *)((long)local_a68 + (long)pdVar75)) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               ((pdVar75[local_1b8.nstride * 2] - pdVar75[local_1b8.nstride]) +
                                pdVar75[local_1b8.nstride * 4] + pdVar75[local_1b8.nstride * 5]) *
                               2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x15] =
                               (pdVar75[local_1b8.nstride * 0xc] -
                               *(double *)((long)local_a68 + (long)pdVar75)) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               (((double)((ulong)pdVar75[local_1b8.nstride * 2] ^ uVar103) -
                                pdVar75[local_1b8.nstride * 4]) + pdVar75[local_1b8.nstride * 5]) *
                               4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x16] =
                               *(double *)((long)local_a68 + (long)pdVar75) * 36.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 2.25 +
                               ((double)((ulong)pdVar75[local_1b8.nstride * 4] ^ uVar103) -
                               pdVar75[local_1b8.nstride * 5]) * 9.0;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x17] =
                               ((double)((ulong)pdVar75[local_1b8.nstride * 0xc] ^ uVar103) -
                               *(double *)((long)local_a68 + (long)pdVar75)) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((pdVar75[local_1b8.nstride * 2] - pdVar75[local_1b8.nstride * 4]) +
                               pdVar75[local_1b8.nstride * 5]) * 4.5;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x18] =
                               (((double)((ulong)pdVar75[local_1b8.nstride * 8] ^ uVar103) -
                                pdVar75[local_1b8.nstride * 0xc]) + pdVar75[local_1b8.nstride * 0xe]
                               + *(double *)((long)local_a68 + (long)pdVar75)) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               ((pdVar75[local_1b8.nstride] - pdVar75[local_1b8.nstride * 2]) +
                                pdVar75[local_1b8.nstride * 4] + pdVar75[local_1b8.nstride * 5]) *
                               2.25;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x19] =
                               ((double)((ulong)pdVar75[local_1b8.nstride * 0xe] ^ uVar103) -
                               *(double *)((long)local_a68 + (long)pdVar75)) * 18.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 1.125 +
                               ((pdVar75[local_1b8.nstride] + pdVar75[local_1b8.nstride * 4]) -
                               pdVar75[local_1b8.nstride * 5]) * 4.5;
                          auVar108 = _DAT_0074fb30;
                          local_9a0[lVar36 + lVar38 + lVar80 + lVar60 * 0x1a] =
                               (pdVar75[local_1b8.nstride * 8] + pdVar75[local_1b8.nstride * 0xc] +
                                pdVar75[local_1b8.nstride * 0xe] +
                               *(double *)((long)local_a68 + (long)pdVar75)) * 9.0 +
                               local_118.p[lVar41 + lVar45 + lVar40] * 0.5625 +
                               (pdVar75[local_1b8.nstride] + pdVar75[local_1b8.nstride * 2] +
                                pdVar75[local_1b8.nstride * 4] + pdVar75[local_1b8.nstride * 5]) *
                               2.25;
                        }
                        dVar90 = local_618.p
                                 [(local_c70 - local_618.begin.y) * local_618.jstride +
                                  (lVar34 - local_618.begin.z) * local_618.kstride +
                                  (lVar78 - local_618.begin.x)];
                      }
                      *(double *)(local_a28 + lVar38 * 8 + lVar80 * 8) = dVar90;
                      lVar78 = lVar78 + 1;
                      lVar76 = lVar76 + 8;
                      pdVar48 = (double *)((long)pdVar48 + 8);
                    } while (local_788.bigend.vect[0] + 1 != (int)lVar78);
                  }
                  local_c70 = local_c70 + 1;
                  local_b88 = local_b88 + local_a70;
                  local_b40 = (double *)((long)local_b40 + local_a70);
                } while (local_788.bigend.vect[1] + 1U != (int)local_c70);
              }
              lVar34 = lVar34 + 1;
              local_9b0 = local_9b0 + local_8b0 * 8;
              local_950 = local_950 + local_8b0 * 8;
            } while (local_788.bigend.vect[2] + 1 != (int)lVar34);
          }
          local_a30 = (long)iStack_760;
          if (iStack_760 <= local_754) {
            local_960 = (ulong)local_768._4_4_;
            local_4d0 = local_960 * 8 + local_a60 * -8;
            local_4d8 = local_970 * 0xd8;
            lVar30 = local_a30 * 8;
            local_9f0 = (local_4d8 + local_a30 * 8 + local_918 * -8) * local_7e0;
            local_658 = local_970 * 0x20;
            local_9b0 = (local_970 * 0x68 + local_a30 * 8 + local_918 * -8) * local_7e0;
            local_950 = (local_970 * 0x50 + local_a30 * 8 + local_918 * -8) * local_7e0;
            local_660 = local_970 * 8;
            local_4e0 = local_970 * 0x18;
            local_958 = (local_970 * 0x60 + local_a30 * 8 + local_918 * -8) * local_7e0;
            local_980 = (ulong)(int)local_768;
            local_4e8 = local_970 * 0x58;
            local_4f0 = local_970 * 0xb8;
            local_4f8 = local_970 * 0x70;
            local_500 = local_970 * 0xd0;
            lVar35 = local_970 * 200;
            lVar34 = local_a30 * 8;
            local_508 = local_970 * 0x28;
            uVar26 = ~(uint)local_a60;
            local_8e8 = (ulong)uVar26;
            uVar25 = ~(uint)local_918;
            local_510 = (ulong)uVar25;
            local_a78 = lVar60 * 0x17;
            local_a80 = lVar60 * 0x88;
            local_a88 = lVar60 * 0x13;
            local_a98 = lVar60 * 0x19;
            local_a90 = lVar60 * 0x15;
            local_a50 = lVar60 * 0x78;
            local_754 = local_754 + 1;
            local_a20 = local_9a0 + (local_980 - lVar44);
            local_a0c = ~(uint)local_918 + iStack_760;
            local_8f0 = (local_9f0 + local_960 * 8 + local_a60 * -8) * lVar54 + local_980 * 8 +
                        lVar44 * -8 + (long)local_9a0;
            local_8f8 = ((lVar30 + local_970 * 0x48 + local_918 * -8) * local_7e0 + local_960 * 8 +
                        local_a60 * -8) * lVar54 + local_980 * 8 + lVar44 * -8 + (long)local_9a0;
            local_b50 = ((local_970 * 0x90 + local_a30 * 8 + local_918 * -8) * local_7e0 +
                         local_960 * 8 + local_a60 * -8) * lVar54 + local_980 * 8 + lVar44 * -8 +
                        (long)local_9a0;
            local_b98 = ((local_970 * 0xb0 + local_a30 * 8 + local_918 * -8) * local_7e0 +
                         local_960 * 8 + local_a60 * -8) * lVar54 + local_980 * 8 + lVar44 * -8 +
                        (long)local_9a0;
            local_9b8 = (local_9b0 + local_960 * 8 + local_a60 * -8) * lVar54 + local_980 * 8 +
                        lVar44 * -8 + (long)local_9a0;
            local_968 = ((local_658 + local_a30 * 8 + local_918 * -8) * local_7e0 + local_960 * 8 +
                        local_a60 * -8) * lVar54 + local_980 * 8 + lVar44 * -8 + (long)local_9a0;
            local_900 = (local_960 * 8 + (local_a30 - local_918) * local_7e0 * 8 + local_a60 * -8) *
                        lVar54 + local_980 * 8 + lVar44 * -8 + (long)local_9a0;
            local_908 = (double *)
                        ((local_950 + local_960 * 8 + local_a60 * -8) * lVar54 + local_980 * 8 +
                         lVar44 * -8 + (long)local_9a0);
            local_880 = (double *)
                        (((local_970 * 0x98 + local_a30 * 8 + local_918 * -8) * local_7e0 +
                          local_960 * 8 + local_a60 * -8) * lVar54 + local_980 * 8 + lVar44 * -8 +
                        (long)local_9a0);
            local_888 = ((local_660 + local_a30 * 8 + local_918 * -8) * local_7e0 + local_960 * 8 +
                        local_a60 * -8) * lVar54 + local_980 * 8 + lVar44 * -8 + (long)local_9a0;
            local_890 = local_980 * 8 +
                        ((local_970 * 0xa8 + local_a30 * 8 + local_918 * -8) * local_7e0 +
                         local_960 * 8 + local_a60 * -8) * lVar54 + lVar44 * -8 + (long)local_9a0;
            local_898 = ((local_4e0 + local_a30 * 8 + local_918 * -8) * local_7e0 + local_960 * 8 +
                        local_a60 * -8) * lVar54 + local_980 * 8 + lVar44 * -8 + (long)local_9a0;
            local_8a0 = (local_958 + local_960 * 8 + local_a60 * -8) * lVar54 + local_980 * 8 +
                        lVar44 * -8 + (long)local_9a0;
            local_720 = ~(uint)local_a60 + local_768._4_4_;
            local_9e0 = (local_970 * 0x10 + local_a30 * 8 + local_918 * -8) * local_7e0;
            local_9e8 = (local_970 * 0xc0 + local_a30 * 8 + local_918 * -8) * local_7e0;
            local_a28 = (local_508 + local_a30 * 8 + local_918 * -8) * local_7e0;
            local_730 = local_740 * lVar51 * 8;
            local_848 = ((local_7d8 * 0x10 + local_a30 * 8 + local_7d0 * -8) * local_740 +
                         local_960 * 8 + local_870 * -8) * lVar51 + local_980 * 8 + lVar27 * -8 +
                        (long)pdVar22;
            local_850 = ((lVar30 + local_7d8 * 0x18 + local_7d0 * -8) * local_740 + local_960 * 8 +
                        local_870 * -8) * lVar51 + local_980 * 8 + lVar27 * -8 + (long)pdVar22;
            local_858 = ((local_7d8 * 0x20 + local_a30 * 8 + local_7d0 * -8) * local_740 +
                         local_960 * 8 + local_870 * -8) * lVar51 + local_980 * 8 + lVar27 * -8 +
                        (long)pdVar22;
            local_860 = ((lVar30 + local_7d8 * 0x28 + local_7d0 * -8) * local_740 + local_960 * 8 +
                        local_870 * -8) * lVar51 + local_980 * 8 + lVar27 * -8 + (long)pdVar22;
            local_868 = ((local_7d8 * 0x30 + local_a30 * 8 + local_7d0 * -8) * local_740 +
                         local_960 * 8 + local_870 * -8) * lVar51 + local_980 * 8 + lVar27 * -8 +
                        (long)pdVar22;
            local_b18 = ((local_7d8 * 0x38 + local_a30 * 8 + local_7d0 * -8) * local_740 +
                         local_960 * 8 + local_870 * -8) * lVar51 + local_980 * 8 + lVar27 * -8 +
                        (long)pdVar22;
            local_988 = CONCAT44(local_988._4_4_,iStack_75c);
            uVar37 = (iStack_75c - (int)local_768) + 1;
            local_a18 = (ulong)uVar37;
            local_8b8 = (ulong)local_758;
            local_a58 = lVar60 * 0x30;
            local_990 = CONCAT44(local_990._4_4_,local_758 + 1);
            local_8c8 = lVar54 * 8;
            local_738 = local_8b0 * 8;
            local_518 = local_970 * 0xa0;
            local_8d0 = lVar51 * 8;
            local_998 = local_a20;
            local_970 = ((local_7d8 * 8 + local_a30 * 8 + local_7d0 * -8) * local_740 +
                         local_960 * 8 + local_870 * -8) * lVar51 + local_980 * 8 + lVar27 * -8 +
                        (long)pdVar22;
            do {
              if (local_768._4_4_ <= (int)local_758) {
                lVar44 = (long)local_a0c;
                local_928 = (local_4d8 + lVar44 * 8) * local_7e0;
                local_ba8 = (double *)((local_4d0 + local_928) * lVar54 + (long)local_a20);
                pdVar48 = (double *)
                          (((local_4e8 + lVar44 * 8) * local_7e0 + local_4d0) * lVar54 +
                          (long)local_a20);
                local_c80 = (double *)
                            (((local_518 + lVar44 * 8) * local_7e0 + local_4d0) * lVar54 +
                            (long)local_a20);
                local_be8 = (double *)
                            (((local_658 + lVar44 * 8) * local_7e0 + local_4d0) * lVar54 +
                            (long)local_a20);
                pdVar75 = (double *)
                          (((local_660 + lVar44 * 8) * local_7e0 + local_4d0) * lVar54 +
                          (long)local_a20);
                pdVar77 = (double *)
                          (((local_4f0 + lVar44 * 8) * local_7e0 + local_4d0) * lVar54 +
                          (long)local_a20);
                local_c10 = (double *)
                            (((local_4e0 + lVar44 * 8) * local_7e0 + local_4d0) * lVar54 +
                            (long)local_a20);
                local_930 = (local_4f8 + lVar44 * 8) * local_7e0;
                pdVar53 = (double *)((local_930 + local_4d0) * lVar54 + (long)local_a20);
                local_8d8 = (local_500 + lVar44 * 8) * local_7e0;
                local_8e0 = (local_508 + lVar44 * 8) * local_7e0;
                lVar78 = (local_a30 - local_918) * local_8b0;
                local_a70 = (int)(uVar25 + (int)local_a30) * local_8b0;
                local_c18 = local_858;
                local_b58 = local_850;
                local_c00 = local_848;
                local_bc8 = local_970;
                local_bf8 = local_8a0;
                local_c70 = local_898;
                local_c78 = local_890;
                local_c68 = local_888;
                local_bd8 = local_880;
                local_b78 = local_908;
                local_be0 = local_900;
                local_ba0 = local_968;
                local_b80 = local_9b8;
                local_bb8 = local_b98;
                local_c58 = local_b50;
                local_bc0 = local_8f8;
                lVar44 = local_b18;
                lVar30 = local_860;
                lVar36 = local_8f0;
                lVar76 = local_868;
                local_aa0 = local_960;
                iVar50 = local_720;
                do {
                  if ((int)local_768 <= iStack_75c) {
                    lVar38 = (long)iVar50;
                    lVar56 = (local_9f0 + lVar38 * 8) * lVar54;
                    lVar39 = ((lVar35 + lVar34 + local_918 * -8) * local_7e0 + lVar38 * 8) * lVar54;
                    lVar40 = (local_a28 + lVar38 * 8) * lVar54;
                    lVar41 = (local_aa0 - local_a60) * lVar54;
                    local_a48 = local_9a0 + lVar41;
                    lVar45 = (int)(uVar26 + (int)local_aa0) * lVar54;
                    local_a68 = (double *)(lVar78 * 8 + local_938 + lVar45 * 8);
                    lVar55 = 0;
                    do {
                      *(double *)(local_bc8 + lVar55 * 8) =
                           (*(double *)
                             ((long)local_a20 + lVar55 * 8 + (local_8e0 + lVar38 * 8) * lVar54) *
                            local_308 +
                           *(double *)
                            ((long)local_a20 + lVar55 * 8 + (local_8d8 + lVar38 * 8) * lVar54) *
                           local_288 +
                           *(double *)
                            ((long)local_a20 + lVar55 * 8 + (local_930 + lVar38 * 8) * lVar54) *
                           local_2e8) *
                           *(double *)
                            ((long)local_a20 + lVar55 * 8 + (local_928 + lVar38 * 8) * lVar54) +
                           (local_c10[lVar55] * local_308 +
                           local_c80[lVar55] * local_288 + pdVar53[lVar55] * local_2e8) *
                           local_ba8[lVar55] +
                           (*(double *)(local_c70 + lVar55 * 8) * local_308 +
                           *(double *)(local_c58 + lVar55 * 8) * local_288 +
                           *(double *)(local_bf8 + lVar55 * 8) * local_2e8) *
                           *(double *)(lVar36 + lVar55 * 8) +
                           (*(double *)((long)local_998 + lVar55 * 8 + lVar40) * local_308 +
                           *(double *)
                            ((long)local_998 + lVar55 * 8 + (local_9e8 + lVar38 * 8) * lVar54) *
                           local_288 +
                           *(double *)
                            ((long)local_998 + lVar55 * 8 + (local_958 + lVar38 * 8) * lVar54) *
                           local_2e8) * *(double *)((long)local_998 + lVar55 * 8 + lVar56);
                      lVar71 = (long)(~iVar18 + (int)local_768 + (int)lVar55);
                      lVar80 = local_938 + lVar41 * 8 + lVar71 * 8;
                      *(double *)(local_c00 + lVar55 * 8) =
                           (local_a48[lVar71 + local_a70 + lVar60 * 7] * local_308 +
                           local_a48[lVar71 + local_a70 + lVar60 * 0x17] * local_2a8 +
                           local_a48[lVar71 + local_a70 + lVar60 * 0x11] * local_298) *
                           *(double *)(lVar80 + local_a70 * 8) +
                           (pdVar75[lVar55] * local_308 +
                           pdVar77[lVar55] * local_2a8 + pdVar48[lVar55] * local_298) *
                           local_ba8[lVar55] +
                           (*(double *)(local_c68 + lVar55 * 8) * local_308 +
                           *(double *)(local_c78 + lVar55 * 8) * local_2a8 +
                           *(double *)(local_bc0 + lVar55 * 8) * local_298) *
                           *(double *)(lVar36 + lVar55 * 8) +
                           (local_a48[lVar71 + lVar78 + lVar60 * 7] * local_308 +
                           local_a48[lVar71 + lVar78 + lVar60 * 0x15] * local_2a8 +
                           local_a48[lVar71 + lVar78 + lVar60 * 0xf] * local_298) *
                           *(double *)(lVar80 + lVar78 * 8);
                      *(double *)(local_b58 + lVar55 * 8) =
                           (local_9a0[lVar45 + lVar78 + lVar71 + lVar60 * 8] * local_2f8 +
                           local_9a0[lVar45 + lVar78 + lVar71 + lVar60 * 0x19] * local_2a8 +
                           local_9a0[lVar45 + lVar78 + lVar71 + lVar60 * 0x10] * local_2e8) *
                           local_a68[lVar71] +
                           (*(double *)
                             ((long)local_998 + lVar55 * 8 + (local_9e0 + lVar38 * 8) * lVar54) *
                            local_2f8 +
                           *(double *)((long)local_998 + lVar55 * 8 + lVar39) * local_2a8 +
                           *(double *)
                            ((long)local_998 + lVar55 * 8 + (local_950 + lVar38 * 8) * lVar54) *
                           local_2e8) * *(double *)((long)local_998 + lVar55 * 8 + lVar56) +
                           (*(double *)(local_be0 + lVar55 * 8) * local_2f8 +
                           local_bd8[lVar55] * local_2a8 + local_b78[lVar55] * local_2e8) *
                           *(double *)(lVar36 + lVar55 * 8) +
                           (local_a48[lVar71 + lVar78 + lVar60 * 6] * local_2f8 +
                           local_a48[lVar71 + lVar78 + lVar60 * 0x13] * local_2a8 +
                           local_a48[lVar71 + lVar78 + lVar60 * 0x10] * local_2e8) *
                           *(double *)(lVar80 + lVar78 * 8);
                      *(double *)(local_c18 + lVar55 * 8) =
                           (*(double *)(local_ba0 + lVar55 * 8) * local_318 +
                           *(double *)(local_c78 + lVar55 * 8) * local_2d8 +
                           *(double *)(local_bf8 + lVar55 * 8) * (double)local_278._0_8_) *
                           *(double *)(lVar36 + lVar55 * 8) +
                           (local_be8[lVar55] * local_318 +
                           pdVar77[lVar55] * local_2d8 + pdVar53[lVar55] * (double)local_278._0_8_)
                           * local_ba8[lVar55];
                      *(double *)(lVar30 + lVar55 * 8) =
                           (*(double *)(local_c70 + lVar55 * 8) * local_1f8 +
                           local_bd8[lVar55] * local_2d8 +
                           *(double *)(local_b80 + lVar55 * 8) * local_2c8) *
                           *(double *)(lVar36 + lVar55 * 8) +
                           (*(double *)((long)local_998 + lVar55 * 8 + lVar40) * local_1f8 +
                           *(double *)((long)local_998 + lVar55 * 8 + lVar39) * local_2d8 +
                           *(double *)
                            ((long)local_998 + lVar55 * 8 + (local_9b0 + lVar38 * 8) * lVar54) *
                           local_2c8) * *(double *)((long)local_998 + lVar55 * 8 + lVar56);
                      *(double *)(lVar76 + lVar55 * 8) =
                           (*(double *)(local_c68 + lVar55 * 8) * local_1f8 +
                           *(double *)(local_bb8 + lVar55 * 8) * local_2b8 +
                           local_b78[lVar55] * (double)local_278._0_8_) *
                           *(double *)(lVar36 + lVar55 * 8) +
                           (local_a48[lVar71 + lVar78 + lVar60 * 7] * local_1f8 +
                           local_a48[lVar71 + lVar78 + lVar60 * 0x16] * local_2b8 +
                           local_a48[lVar71 + lVar78 + lVar60 * 0x10] * (double)local_278._0_8_) *
                           *(double *)(lVar80 + lVar78 * 8);
                      *(double *)(lVar44 + lVar55 * 8) =
                           (*(double *)(local_ba0 + lVar55 * 8) * local_1c8 +
                           *(double *)(local_bb8 + lVar55 * 8) * local_1d8 +
                           *(double *)(local_b80 + lVar55 * 8) * (double)local_1e8._0_8_) *
                           *(double *)(lVar36 + lVar55 * 8);
                      lVar55 = lVar55 + 1;
                    } while (uVar37 != (uint)lVar55);
                  }
                  local_aa0 = local_aa0 + 1;
                  local_ba8 = local_ba8 + lVar54;
                  lVar36 = lVar36 + local_8c8;
                  pdVar48 = pdVar48 + lVar54;
                  local_c80 = local_c80 + lVar54;
                  local_be8 = local_be8 + lVar54;
                  pdVar75 = pdVar75 + lVar54;
                  pdVar77 = pdVar77 + lVar54;
                  local_c10 = local_c10 + lVar54;
                  pdVar53 = pdVar53 + lVar54;
                  local_bc0 = local_bc0 + local_8c8;
                  local_c58 = local_c58 + local_8c8;
                  local_bb8 = local_bb8 + local_8c8;
                  local_b80 = local_b80 + local_8c8;
                  local_ba0 = local_ba0 + local_8c8;
                  local_be0 = local_be0 + local_8c8;
                  local_b78 = local_b78 + lVar54;
                  local_bd8 = local_bd8 + lVar54;
                  local_c68 = local_c68 + local_8c8;
                  local_c78 = local_c78 + local_8c8;
                  local_c70 = local_c70 + local_8c8;
                  local_bf8 = local_bf8 + local_8c8;
                  iVar50 = iVar50 + 1;
                  local_bc8 = local_bc8 + local_8d0;
                  local_c00 = local_c00 + local_8d0;
                  local_b58 = local_b58 + local_8d0;
                  local_c18 = local_c18 + local_8d0;
                  lVar30 = lVar30 + local_8d0;
                  lVar76 = lVar76 + local_8d0;
                  lVar44 = lVar44 + local_8d0;
                } while (local_758 + 1 != (int)local_aa0);
              }
              local_a30 = local_a30 + 1;
              local_a0c = local_a0c + 1;
              local_8f0 = local_8f0 + local_738;
              local_8f8 = local_8f8 + local_738;
              local_b50 = local_b50 + local_738;
              local_b98 = local_b98 + local_738;
              local_9b8 = local_9b8 + local_738;
              local_968 = local_968 + local_738;
              local_900 = local_900 + local_738;
              local_908 = local_908 + local_8b0;
              local_880 = local_880 + local_8b0;
              local_888 = local_888 + local_738;
              local_890 = local_890 + local_738;
              local_898 = local_898 + local_738;
              local_8a0 = local_8a0 + local_738;
              local_998 = local_998 + local_8b0;
              local_970 = local_970 + local_730;
              local_848 = local_848 + local_730;
              local_850 = local_850 + local_730;
              local_858 = local_858 + local_730;
              local_860 = local_860 + local_730;
              local_868 = local_868 + local_730;
              local_b18 = local_b18 + local_730;
            } while (local_754 != (int)local_a30);
          }
          local_7c8 = CONCAT44(local_7c8._4_4_,local_754);
          local_c80 = (double *)(long)local_71c.smallend.vect[2];
          if (local_71c.smallend.vect[2] <= local_71c.bigend.vect[2]) {
            local_9a0 = (double *)(ulong)(uint)local_71c.bigend.vect[1];
            local_8d8 = (long)local_71c.smallend.vect[1];
            lVar54 = (long)local_71c.smallend.vect[0];
            local_9e0 = lVar54 * 8;
            local_948 = local_948 + (lVar54 - local_8c0);
            local_a00 = local_a00 * -8;
            local_a08 = local_a08 * 8;
            lVar34 = local_9e0 + lVar27 * -8;
            lVar60 = local_7d8 * 0x38 + local_7d0 * -8;
            local_9f0 = local_7d8 * 0x28 + local_7d0 * -8;
            local_9b0 = local_7d8 * 0x20 + local_7d0 * -8;
            local_950 = local_7d8 * 0x10;
            local_958 = local_7d8 * 0x30 + local_7d0 * -8;
            local_a28 = local_7d8 * 8 + local_7d0 * -8;
            local_8e8 = local_7d8 * 0x18 + local_7d0 * -8;
            local_7d8 = local_7d8 * 0x40 + local_7d0 * -8;
            local_950 = local_950 + local_7d0 * -8;
            local_a30 = local_870 * -8;
            local_870 = ~local_870 * 8;
            local_9a8 = local_9a8 + (lVar54 - local_920);
            local_a40 = local_a40 * -4;
            local_a38 = local_a38 * 4;
            local_9e8 = CONCAT44(local_9e8._4_4_,local_71c.smallend.vect[0] + 1);
            local_960 = lVar60 - 8;
            local_8f0 = local_9f0 + -8;
            local_8f8 = local_958 - 8;
            uVar103 = (ulong)local_938 >> 0x20;
            local_938 = CONCAT44((int)uVar103,local_71c.bigend.vect[2] + 1);
            local_930 = CONCAT44(local_930._4_4_,local_71c.bigend.vect[0]);
            local_8e0 = CONCAT44(local_8e0._4_4_,local_71c.bigend.vect[1] + 1U);
            do {
              if (local_71c.smallend.vect[1] <= local_71c.bigend.vect[1]) {
                local_a70 = ((long)local_c80 - local_910) * local_a38 + local_a40;
                local_a78 = ((long)local_c80 - local_8a8) * local_a08 + local_a00;
                local_a80 = (local_960 + (long)local_c80 * 8) * local_740;
                local_a88 = local_a30 + local_a80;
                local_a90 = (local_8f0 + (long)local_c80 * 8) * local_740 + local_a30;
                lVar30 = (lVar60 + (long)local_c80 * 8) * local_740;
                local_a50 = (local_9f0 + (long)local_c80 * 8) * local_740 + local_a30;
                local_a58 = (local_9b0 + (long)local_c80 * 8) * local_740;
                local_a18 = local_a30 + local_a58;
                local_aa0 = (local_a28 + (long)local_c80 * 8) * local_740 + local_a30;
                local_a80 = local_a80 + local_870;
                local_a98 = lVar30 + local_870;
                local_a58 = local_a58 + local_870;
                lVar35 = (local_8f8 + (long)local_c80 * 8) * local_740;
                local_a60 = (local_7d8 + (long)local_c80 * 8) * local_740 + local_a30;
                lVar44 = (local_958 + (long)local_c80 * 8) * local_740;
                local_988 = (local_8e8 + (long)local_c80 * 8) * local_740 + local_a30;
                local_990 = (local_950 + (long)local_c80 * 8) * local_740;
                local_8c8 = local_a30 + lVar35;
                local_998 = (double *)(local_a30 + lVar44);
                local_980 = lVar44 + local_870;
                local_a20 = (double *)(local_a30 + local_990);
                local_990 = local_990 + local_870;
                local_928 = (long)local_c80 + -1;
                local_8d0 = (long)local_c80 + 1;
                lVar44 = local_8d8;
                do {
                  iVar18 = (int)lVar44;
                  if (local_71c.smallend.vect[0] <= local_71c.bigend.vect[0]) {
                    lVar56 = lVar44 - local_700.begin.y;
                    lVar67 = local_700.jstride * lVar56;
                    lVar76 = (long)local_c80 - (long)local_700.begin.z;
                    lVar68 = local_700.kstride * lVar76;
                    lVar78 = (long)((iVar18 + 1) - local_700.begin.y);
                    lVar45 = local_928 - local_700.begin.z;
                    lVar72 = local_700.kstride * lVar45;
                    lVar79 = (lVar44 - local_6c0.begin.y) * local_6c0.jstride;
                    lVar38 = (long)(((int)local_c80 + 1) - local_700.begin.z);
                    lVar70 = ((long)local_c80 - (long)local_6c0.begin.z) * local_6c0.kstride;
                    lVar73 = (long)local_6c0.begin.x;
                    lVar74 = local_700.kstride * lVar38;
                    lVar36 = local_700.kstride * 8;
                    lVar38 = lVar38 * lVar36;
                    lVar45 = lVar45 * lVar36;
                    lVar36 = lVar36 * lVar76;
                    lVar40 = local_700.jstride * 8;
                    lVar39 = lVar56 * lVar40;
                    lVar41 = (lVar56 + -1) * lVar40;
                    lVar40 = lVar40 * lVar78;
                    lVar76 = (long)local_700.begin.x;
                    local_a48 = local_700.p + local_700.jstride * (lVar56 + -1);
                    local_a68 = local_700.p + local_700.jstride * lVar78;
                    lVar57 = lVar39 + lVar38 + lVar76 * -8 + local_9e0;
                    lVar58 = lVar39 + lVar45 + lVar76 * -8 + local_9e0;
                    lVar59 = lVar39 + lVar36 + lVar76 * -8 + local_9e0;
                    lVar61 = lVar41 + lVar38 + lVar76 * -8 + local_9e0;
                    lVar62 = lVar41 + lVar45 + lVar76 * -8 + local_9e0;
                    lVar63 = lVar41 + lVar36 + lVar76 * -8 + local_9e0;
                    lVar64 = lVar38 + lVar40 + lVar76 * -8 + local_9e0;
                    lVar65 = lVar45 + lVar40 + lVar76 * -8 + local_9e0;
                    lVar66 = lVar40 + lVar36 + lVar76 * -8 + local_9e0;
                    lVar36 = (local_a88 + lVar44 * 8) * lVar51 + lVar34;
                    lVar76 = (local_a90 + lVar44 * 8) * lVar51 + lVar34;
                    lVar78 = (local_a30 + lVar30 + lVar44 * 8) * lVar51 + lVar34;
                    lVar38 = (local_a50 + lVar44 * 8) * lVar51 + lVar34;
                    lVar41 = (local_a18 + lVar44 * 8) * lVar51 + lVar34;
                    lVar45 = (local_aa0 + lVar44 * 8) * lVar51 + lVar34;
                    lVar56 = (local_a80 + lVar44 * 8) * lVar51 + lVar34;
                    lVar39 = (local_a98 + lVar44 * 8) * lVar51 + lVar34;
                    lVar40 = (local_a58 + lVar44 * 8) * lVar51 + lVar34;
                    lVar55 = (local_8c8 + lVar44 * 8) * lVar51 + lVar34;
                    lVar80 = (((local_8e8 - 8) + (long)local_c80 * 8) * local_740 + local_a30 +
                             lVar44 * 8) * lVar51 + lVar34;
                    lVar71 = (((long)local_c80 - local_7d0) * local_740 * 8 + local_a30 + lVar44 * 8
                             ) * lVar51 + lVar34;
                    lVar31 = (long)(local_998 + lVar44) * lVar51 + lVar34;
                    lVar46 = (local_988 + lVar44 * 8) * lVar51 + lVar34;
                    lVar47 = (long)(local_a20 + lVar44) * lVar51 + lVar34;
                    lVar42 = (lVar35 + local_870 + lVar44 * 8) * lVar51 + lVar34;
                    lVar49 = (local_980 + lVar44 * 8) * lVar51 + lVar34;
                    lVar52 = (local_990 + lVar44 * 8) * lVar51 + lVar34;
                    lVar69 = 0;
                    do {
                      if (((lVar54 + lVar69 < (long)local_ac8.smallend.vect[0]) ||
                          (lVar44 < local_ac8.smallend.vect[1])) ||
                         (((long)local_c80 < (long)local_ac8.smallend.vect[2] ||
                          ((((long)local_ac8.bigend.vect[0] < lVar54 + lVar69 ||
                            (local_ac8.bigend.vect[1] < lVar44)) ||
                           ((long)local_ac8.bigend.vect[2] < (long)local_c80)))))) {
                        local_6c0.p[lVar54 + ((lVar79 + lVar70 + lVar69) - lVar73)] = 0.0;
                      }
                      else {
                        *(double *)((long)pdVar22 + lVar69 * 8 + lVar71) =
                             -(*(double *)((long)pdVar22 + lVar69 * 8 + lVar45 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar45) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar52) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar47) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar80) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar46) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar40 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar40) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar41 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar41) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar76 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar76) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar38 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar38) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar42) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar55) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar49) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar31) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar56 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar56) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar36 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar36) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar39 + -8) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar39) +
                               *(double *)((long)pdVar22 + lVar69 * 8 + lVar78 + -8) +
                              *(double *)((long)pdVar22 + lVar69 * 8 + lVar78));
                        *(double *)
                         ((long)pdVar22 + lVar69 * 8 + (local_a60 + lVar44 * 8) * lVar51 + lVar34) =
                             1.0 / (ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar78)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar78 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar39)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar39 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar36)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar36 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar56)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar56 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar31)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar49)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar55)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar42)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar38)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar38 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar76)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar76 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar41)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar41 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar40)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar40 + -8)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar46)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar80)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar47)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar52)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar45)) +
                                    ABS(*(double *)((long)pdVar22 + lVar69 * 8 + lVar45 + -8)) +
                                   1e-100);
                        dVar90 = 0.0;
                        if (*(int *)((long)local_9a8 +
                                    lVar69 * 4 + (local_a70 + lVar44 * 4) * local_940) == 0) {
                          lVar81 = (long)(((local_71c.smallend.vect[0] + 1) - local_700.begin.x) +
                                         (int)lVar69);
                          dVar90 = local_a68[lVar81 + lVar74] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar78) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar64 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar78 + -8) +
                                   local_a48[lVar81 + lVar74] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar39) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar61 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar39 + -8) +
                                   local_a68[lVar81 + lVar72] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar36) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar65 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar36 + -8) +
                                   local_a48[lVar81 + lVar72] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar56) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar62 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar56 + -8) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar64) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar31) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar61) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar49) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar65) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar55) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar62) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar42) +
                                   local_700.p[lVar67 + lVar81 + lVar74] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar38) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar57 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar38 + -8) +
                                   local_700.p[lVar67 + lVar81 + lVar72] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar76) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar58 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar76 + -8) +
                                   local_a68[lVar81 + lVar68] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar41) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar66 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar41 + -8) +
                                   local_a48[lVar81 + lVar68] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar40) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar63 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar40 + -8) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar57) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar46) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar58) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar80) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar66) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar47) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar63) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar52) +
                                   local_700.p[lVar67 + lVar81 + lVar68] *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar45) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar59) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar71) +
                                   *(double *)((long)local_700.p + lVar69 * 8 + lVar59 + -8) *
                                   *(double *)((long)pdVar22 + lVar69 * 8 + lVar45 + -8);
                        }
                        local_6c0.p[lVar54 + ((lVar79 + lVar70 + lVar69) - lVar73)] = dVar90;
                        local_6c0.p[lVar54 + ((lVar79 + lVar70 + lVar69) - lVar73)] =
                             *(double *)
                              ((long)local_948 + lVar69 * 8 + (local_a78 + lVar44 * 8) * local_9f8)
                             - dVar90;
                      }
                      lVar69 = lVar69 + 1;
                    } while ((local_71c.bigend.vect[0] - local_71c.smallend.vect[0]) + 1 !=
                             (int)lVar69);
                  }
                  lVar44 = lVar44 + 1;
                } while (iVar18 + 1 != local_71c.bigend.vect[1] + 1U);
              }
              local_c80 = (double *)((long)local_c80 + 1);
            } while (local_71c.bigend.vect[2] + 1 != (int)local_c80);
          }
          local_680 = lVar27;
          _local_638 = uVar21;
          Gpu::Elixir::~Elixir(&local_60);
          Gpu::Elixir::~Elixir(&local_178);
        }
        else {
          iVar18 = (int)local_818;
          if ((int)local_818 <= local_9d8.smallend.vect[0]) {
            iVar18 = local_9d8.smallend.vect[0];
          }
          iVar50 = local_818._4_4_;
          if (local_818._4_4_ <= local_9d8.smallend.vect[1]) {
            iVar50 = local_9d8.smallend.vect[1];
          }
          lVar34 = (long)local_9d8.smallend.vect[2];
          iVar33 = local_810;
          if (local_810 <= local_9d8.smallend.vect[2]) {
            iVar33 = local_9d8.smallend.vect[2];
          }
          iVar24 = local_80c[0];
          if (local_9d8.bigend.vect[0] <= local_80c[0]) {
            iVar24 = local_9d8.bigend.vect[0];
          }
          iVar112 = local_80c[1];
          if (local_9d8.bigend.vect[1] <= local_80c[1]) {
            iVar112 = local_9d8.bigend.vect[1];
          }
          iVar14 = (int)uStack_804;
          if (local_9d8.bigend.vect[2] <= (int)uStack_804) {
            iVar14 = local_9d8.bigend.vect[2];
          }
          if ((FabArray<amrex::FArrayBox> *)*local_678 == (FabArray<amrex::FArrayBox> *)0x0) {
            if (local_9d8.smallend.vect[2] <= local_9d8.bigend.vect[2]) {
              RVar11 = local_878->m_const_sigma;
              local_c78 = ((long)local_9d8.smallend.vect[1] * 8 + (lVar34 - lVar54) * lVar27 * 8 +
                          lVar51 * -8) * lVar44 + (long)local_9d8.smallend.vect[0] * 8 + lVar60 * -8
                          + (long)pdVar22;
              do {
                lVar30 = (long)local_9d8.smallend.vect[1];
                lVar36 = local_c78;
                if (local_9d8.smallend.vect[1] <= local_9d8.bigend.vect[1]) {
                  do {
                    if (local_9d8.smallend.vect[0] <= local_9d8.bigend.vect[0]) {
                      lVar76 = 0;
                      do {
                        lVar78 = local_9d8.smallend.vect[0] + lVar76;
                        if (((((lVar78 < iVar18) || (lVar30 < iVar50)) || (lVar34 < iVar33)) ||
                            ((iVar24 < lVar78 || (iVar112 < lVar30)))) ||
                           (RVar98 = RVar11, iVar14 < lVar34)) {
                          RVar98 = 0.0;
                        }
                        *(Real *)(lVar36 + lVar76 * 8) = RVar98;
                        lVar76 = lVar76 + 1;
                      } while ((local_9d8.bigend.vect[0] - local_9d8.smallend.vect[0]) + 1 !=
                               (int)lVar76);
                    }
                    lVar30 = lVar30 + 1;
                    lVar36 = lVar36 + lVar44 * 8;
                  } while (local_9d8.bigend.vect[1] + 1 != (int)lVar30);
                }
                lVar34 = lVar34 + 1;
                local_c78 = local_c78 + lVar35 * 8;
              } while (local_9d8.bigend.vect[2] + 1 != (int)lVar34);
            }
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_618,(FabArray<amrex::FArrayBox> *)*local_678,&local_5d8);
            lVar34 = (long)local_9d8.smallend.vect[2];
            if (local_9d8.smallend.vect[2] <= local_9d8.bigend.vect[2]) {
              lVar30 = (long)local_9d8.smallend.vect[0];
              lVar36 = ((long)local_9d8.smallend.vect[1] * 8 + (lVar34 - lVar54) * lVar27 * 8 +
                       lVar51 * -8) * lVar44 + lVar30 * 8 + lVar60 * -8 + (long)pdVar22;
              do {
                lVar76 = (long)local_9d8.smallend.vect[1];
                lVar78 = lVar36;
                if (local_9d8.smallend.vect[1] <= local_9d8.bigend.vect[1]) {
                  do {
                    if (local_9d8.smallend.vect[0] <= local_9d8.bigend.vect[0]) {
                      lVar38 = 0;
                      do {
                        dVar90 = 0.0;
                        if ((((long)iVar18 <= lVar30 + lVar38) && (iVar50 <= lVar76)) &&
                           ((iVar33 <= lVar34 &&
                            (((lVar30 + lVar38 <= (long)iVar24 && (lVar76 <= iVar112)) &&
                             (lVar34 <= iVar14)))))) {
                          dVar90 = local_618.p
                                   [lVar30 + (((lVar76 - local_618.begin.y) * local_618.jstride +
                                              (lVar34 - local_618.begin.z) * local_618.kstride +
                                              lVar38) - (long)local_618.begin.x)];
                        }
                        *(double *)(lVar78 + lVar38 * 8) = dVar90;
                        lVar38 = lVar38 + 1;
                      } while ((local_9d8.bigend.vect[0] - local_9d8.smallend.vect[0]) + 1 !=
                               (int)lVar38);
                    }
                    lVar76 = lVar76 + 1;
                    lVar78 = lVar78 + lVar44 * 8;
                  } while (local_9d8.bigend.vect[1] + 1 != (int)lVar76);
                }
                lVar34 = lVar34 + 1;
                lVar36 = lVar36 + lVar35 * 8;
              } while (local_9d8.bigend.vect[2] + 1 != (int)lVar34);
            }
          }
          local_c70 = (long)local_71c.smallend.vect[2];
          if (local_71c.smallend.vect[2] <= local_71c.bigend.vect[2]) {
            lVar30 = (long)local_71c.smallend.vect[0];
            lVar34 = lVar30 * 8;
            local_948 = local_948 + (lVar30 - local_8c0);
            local_a00 = local_a00 * -8;
            local_a08 = local_a08 * 8;
            local_9a8 = local_9a8 + (lVar30 - local_920);
            local_a40 = local_a40 * -4;
            local_a38 = local_a38 * 4;
            lVar60 = lVar34 + lVar60 * -8;
            uVar103 = lVar51 * 8 ^ 0xfffffffffffffff8;
            do {
              if (local_71c.smallend.vect[1] <= local_71c.bigend.vect[1]) {
                lVar76 = (local_c70 - lVar54) * lVar27 * 8;
                lVar36 = ((local_c70 + -1) - lVar54) * lVar27 * 8;
                lVar35 = (long)local_71c.smallend.vect[1];
                do {
                  iVar18 = (int)lVar35;
                  if (local_71c.smallend.vect[0] <= local_71c.bigend.vect[0]) {
                    lVar45 = lVar35 - local_700.begin.y;
                    lVar57 = local_700.jstride * lVar45;
                    lVar56 = local_c70 - local_700.begin.z;
                    lVar58 = local_700.kstride * lVar56;
                    lVar59 = local_700.jstride * (lVar45 + -1);
                    lVar41 = (local_c70 + -1) - (long)local_700.begin.z;
                    lVar63 = local_700.kstride * lVar41;
                    lVar78 = (long)((iVar18 + 1) - local_700.begin.y);
                    lVar38 = (long)(((int)local_c70 + 1) - local_700.begin.z);
                    lVar61 = (lVar35 - local_6c0.begin.y) * local_6c0.jstride;
                    lVar42 = (local_c70 - local_6c0.begin.z) * local_6c0.kstride;
                    lVar49 = (long)local_6c0.begin.x;
                    lVar52 = local_700.kstride * lVar38;
                    lVar31 = local_700.kstride * 8;
                    lVar38 = lVar38 * lVar31;
                    lVar41 = lVar41 * lVar31;
                    lVar31 = lVar31 * lVar56;
                    lVar64 = local_700.jstride * lVar78;
                    lVar47 = local_700.jstride * 8;
                    lVar40 = lVar45 * lVar47;
                    lVar45 = (lVar45 + -1) * lVar47;
                    lVar47 = lVar47 * lVar78;
                    lVar78 = (long)local_700.begin.x;
                    lVar56 = lVar40 + lVar38 + lVar78 * -8 + lVar34;
                    lVar39 = lVar41 + lVar40 + lVar78 * -8 + lVar34;
                    lVar40 = lVar40 + lVar31 + lVar78 * -8 + lVar34;
                    lVar55 = lVar31 + lVar45 + lVar78 * -8 + lVar34;
                    lVar80 = lVar38 + lVar45 + lVar78 * -8 + lVar34;
                    lVar71 = lVar45 + lVar41 + lVar78 * -8 + lVar34;
                    lVar31 = lVar31 + lVar47 + lVar78 * -8 + lVar34;
                    lVar46 = lVar38 + lVar47 + lVar78 * -8 + lVar34;
                    lVar47 = lVar47 + lVar41 + lVar78 * -8 + lVar34;
                    lVar78 = (uVar103 + lVar76 + lVar35 * 8) * lVar44 + lVar60;
                    lVar38 = (uVar103 + lVar36 + lVar35 * 8) * lVar44 + lVar60;
                    lVar41 = (lVar76 + lVar51 * -8 + lVar35 * 8) * lVar44 + lVar60;
                    lVar45 = (lVar36 + lVar51 * -8 + lVar35 * 8) * lVar44 + lVar60;
                    lVar62 = 0;
                    do {
                      if (((lVar30 + lVar62 < (long)local_ac8.smallend.vect[0]) ||
                          (lVar35 < local_ac8.smallend.vect[1])) ||
                         (((local_c70 < local_ac8.smallend.vect[2] ||
                           (((long)local_ac8.bigend.vect[0] < lVar30 + lVar62 ||
                            (local_ac8.bigend.vect[1] < lVar35)))) ||
                          (local_ac8.bigend.vect[2] < local_c70)))) {
                        local_6c0.p[lVar30 + ((lVar61 + lVar42 + lVar62) - lVar49)] = 0.0;
                      }
                      else {
                        dVar90 = 0.0;
                        if (*(int *)((long)local_9a8 +
                                    lVar62 * 4 +
                                    ((local_c70 - local_910) * local_a38 + local_a40 + lVar35 * 4) *
                                    local_940) == 0) {
                          dVar90 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar38 + -8);
                          dVar113 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar38);
                          dVar99 = dVar90 + dVar113;
                          dVar106 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar45 + -8);
                          dVar107 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar45);
                          dVar91 = dVar99 + dVar106 + dVar107;
                          dVar97 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar78 + -8);
                          dVar109 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar78);
                          dVar2 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar41 + -8);
                          dVar84 = *(double *)((long)pdVar22 + lVar62 * 8 + lVar41);
                          lVar65 = (long)(((local_71c.smallend.vect[0] + 1) - local_700.begin.x) +
                                         (int)lVar62);
                          dVar90 = (dVar91 * *(double *)((long)local_700.p + lVar62 * 8 + lVar39) +
                                   (dVar97 + dVar109 + dVar2 + dVar84) *
                                   *(double *)((long)local_700.p + lVar62 * 8 + lVar56)) * local_268
                                   + ((dVar99 + dVar97 + dVar109) *
                                      *(double *)((long)local_700.p + lVar62 * 8 + lVar55) +
                                     (dVar106 + dVar107 + dVar2 + dVar84) *
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar31)) *
                                     local_218 +
                                     ((dVar90 + dVar106 + dVar97 + dVar2) *
                                      *(double *)((long)local_700.p + lVar62 * 8 + lVar40 + -8) +
                                     (dVar113 + dVar107 + dVar109 + dVar84) *
                                     local_700.p[lVar57 + lVar65 + lVar58]) * local_208 +
                                     ((dVar107 + dVar84) * local_700.p[lVar64 + lVar65 + lVar58] +
                                     (dVar106 + dVar2) *
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar31 + -8) +
                                     (dVar90 + dVar97) *
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar55 + -8) +
                                     (dVar113 + dVar109) * local_700.p[lVar59 + lVar65 + lVar58]) *
                                     local_258 +
                                     ((dVar109 + dVar84) * local_700.p[lVar57 + lVar65 + lVar52] +
                                     (dVar97 + dVar2) *
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar56 + -8) +
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar39 + -8) *
                                     (dVar90 + dVar106) +
                                     local_700.p[lVar57 + lVar65 + lVar63] * (dVar113 + dVar107)) *
                                     (double)local_248._0_8_ +
                                     ((dVar2 + dVar84) *
                                      *(double *)((long)local_700.p + lVar62 * 8 + lVar46) +
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar80) *
                                     (dVar97 + dVar109) +
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar71) * dVar99 +
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar47) *
                                     (dVar106 + dVar107)) * local_238 +
                                     (local_700.p[lVar64 + lVar65 + lVar52] * dVar84 +
                                     *(double *)((long)local_700.p + lVar62 * 8 + lVar46 + -8) *
                                     dVar2 + local_700.p[lVar59 + lVar65 + lVar52] * dVar109 +
                                             *(double *)
                                              ((long)local_700.p + lVar62 * 8 + lVar80 + -8) *
                                             dVar97 + local_700.p[lVar64 + lVar65 + lVar63] *
                                                      dVar107 + *(double *)
                                                                 ((long)local_700.p +
                                                                 lVar62 * 8 + lVar47 + -8) * dVar106
                                                                + *(double *)
                                                                   ((long)local_700.p +
                                                                   lVar62 * 8 + lVar71 + -8) *
                                                                  dVar90 + local_700.p
                                                                           [lVar59 + lVar65 + lVar63
                                                                           ] * dVar113) * local_228
                                     + (dVar91 + dVar97 + dVar109 + dVar2 + dVar84) *
                                       *(double *)((long)local_700.p + lVar62 * 8 + lVar40) * -4.0 *
                                       local_228;
                        }
                        local_6c0.p[lVar30 + ((lVar61 + lVar42 + lVar62) - lVar49)] = dVar90;
                        local_6c0.p[lVar30 + ((lVar61 + lVar42 + lVar62) - lVar49)] =
                             *(double *)
                              ((long)local_948 +
                              lVar62 * 8 +
                              ((local_c70 - local_8a8) * local_a08 + local_a00 + lVar35 * 8) *
                              local_9f8) - dVar90;
                      }
                      lVar62 = lVar62 + 1;
                    } while ((local_71c.bigend.vect[0] - local_71c.smallend.vect[0]) + 1 !=
                             (int)lVar62);
                  }
                  lVar35 = lVar35 + 1;
                } while (iVar18 + 1 != local_71c.bigend.vect[1] + 1U);
              }
              local_c70 = local_c70 + 1;
            } while (local_71c.bigend.vect[2] + 1 != (int)local_c70);
          }
        }
        Gpu::Elixir::~Elixir(&local_160);
        Gpu::Elixir::~Elixir(&local_148);
        Gpu::Elixir::~Elixir(&local_130);
      }
      MFIter::operator++(&local_5d8);
    } while (local_5d8.currentIndex < local_5d8.endIndex);
  }
  MFIter::~MFIter(&local_5d8);
  local_480._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_480);
  local_438._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_438);
  local_3a8._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bc98;
  BaseFab<int>::clear(&local_3a8);
  local_3f0._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_3f0);
  local_360._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_360);
  return;
}

Assistant:

void
MLNodeLaplacian::compSyncResidualFine (MultiFab& sync_resid, const MultiFab& phi, const MultiFab& vold,
                                       const MultiFab* rhcc)
{
    BL_PROFILE("MLNodeLaplacian::SyncResFine()");

    const auto& sigma_orig = m_sigma[0][0][0];
    const iMultiFab& dmsk = *m_dirichlet_mask[0][0];

    const auto lobc = LoBC();
    const auto hibc = HiBC();

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[0][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* intg = m_integral[0].get();
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

    const Geometry& geom = m_geom[0][0];
    const Box& ccdom = geom.Domain();
    const Box& nddom = amrex::surroundingNodes(ccdom);
    const auto dxinv = geom.InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox rhs, u;
        IArrayBox tmpmask;
#ifdef AMREX_USE_EB
        FArrayBox sten, cn;
#endif
        for (MFIter mfi(sync_resid,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();

            auto typ = FabType::regular;
#ifdef AMREX_USE_EB
            if (factory) {
                typ = (*flags)[mfi].getType(amrex::enclosedCells(bx));
            }
#endif
            if (typ != FabType::covered)
            {
                const Box& gbx = mfi.growntilebox();
                const Box& vbx = mfi.validbox();
                const Box& ccvbx = amrex::enclosedCells(vbx);
                const Box& bxg1 = amrex::grow(bx,1);
                const Box& ccbxg1 = amrex::enclosedCells(bxg1);

                u.resize(ccbxg1, AMREX_SPACEDIM);
                Elixir ueli = u.elixir();
                Array4<Real> const& uarr = u.array();

                Box ovlp = ccvbx & ccbxg1;
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                {
                    if (m_lobc[0][idim] == LinOpBCType::inflow)
                    {
                        if (ovlp.smallEnd(idim) == ccdom.smallEnd(idim)) {
                            ovlp.growLo(idim, 1);
                        }
                    }
                    if (m_hibc[0][idim] == LinOpBCType::inflow)
                    {
                        if (ovlp.bigEnd(idim) == ccdom.bigEnd(idim)) {
                            ovlp.growHi(idim, 1);
                        }
                    }
                }

                Array4<Real const> const& voarr = vold.const_array(mfi);
                AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                {
                    if (ovlp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                        AMREX_D_TERM(uarr(i,j,k,0) = voarr(i,j,k,0);,
                                     uarr(i,j,k,1) = voarr(i,j,k,1);,
                                     uarr(i,j,k,2) = voarr(i,j,k,2););
                    } else {
                        AMREX_D_TERM(uarr(i,j,k,0) = 0.0;,
                                     uarr(i,j,k,1) = 0.0;,
                                     uarr(i,j,k,2) = 0.0;);
                    }
                });

                tmpmask.resize(bx);
                Elixir tmeli = tmpmask.elixir();
                Array4<int> const& tmpmaskarr = tmpmask.array();
                Array4<int const> const& dmskarr = dmsk.const_array(mfi);
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    tmpmaskarr(i,j,k) = 1-dmskarr(i,j,k);
                });

                rhs.resize(bx);
                Elixir rhseli = rhs.elixir();
                Array4<Real> const& rhsarr = rhs.array();

#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_divu_eb(i,j,k,rhsarr,uarr,vfracarr,intgarr,tmpmaskarr,dxinv,nddom,lobc,hibc);
                    });
                }
                else
#endif
                {
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_divu(i,j,k,rhsarr,uarr,tmpmaskarr,dxinv,nddom,lobc,hibc,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_divu(i,j,k,rhsarr,uarr,tmpmaskarr,dxinv,nddom,lobc,hibc);
                    });
#endif
                }

                if (rhcc)
                {
                    Array4<Real> rhccarr = uarr;
                    Array4<Real const> const& rhccarr_orig = rhcc->const_array(mfi);
                    const Box& ovlp3 = ccvbx & ccbxg1;
                    AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                    {
                        if (ovlp3.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            rhccarr(i,j,k) = rhccarr_orig(i,j,k);
                        } else {
                            rhccarr(i,j,k) = 0.0;
                        }
                    });
#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            Real rhs2 = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,tmpmaskarr);
                            rhsarr(i,j,k) += rhs2;
                        });
                    }
                    else
#endif
                    {
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            Real rhs2 = mlndlap_rhcc(i,j,k,rhccarr,tmpmaskarr);
                            rhsarr(i,j,k) += rhs2;
                        });
                    }
                }

                Array4<Real> const& sync_resid_a = sync_resid.array(mfi);
                Array4<Real const> const& phiarr = phi.const_array(mfi);
#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);

                    Box stbx = bx;
                    AMREX_D_TERM(stbx.growLo(0,1);, stbx.growLo(1,1);, stbx.growLo(2,1));
                    Box const& sgbx = amrex::grow(amrex::enclosedCells(stbx),1);

                    constexpr int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
                    sten.resize(stbx,ncomp_s);
                    Elixir steneli = sten.elixir();
                    Array4<Real> const& stenarr = sten.array();

                    constexpr int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                    cn.resize(sgbx,ncomp_c+1);
                    Elixir cneli = cn.elixir();
                    Array4<Real> const& cnarr = cn.array();
                    Array4<Real> const& sgarr = cn.array(ncomp_c);

                    Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);

                    const Box& ibx = sgbx & amrex::enclosedCells(mfi.validbox());
                    AMREX_HOST_DEVICE_FOR_3D(sgbx, i, j, k,
                    {
                        if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                            sgarr(i,j,k) = sigmaarr_orig(i,j,k);
                        } else {
                            for (int n = 0; n < ncomp_c; ++n) {
                                cnarr(i,j,k,n) = 0.0;
                            }
                            sgarr(i,j,k) = 0.0;
                        }
                    });

                    AMREX_HOST_DEVICE_FOR_3D(stbx, i, j, k,
                    {
                        mlndlap_set_stencil_eb(i, j, k, stenarr, sgarr, cnarr, dxinv);
                    });

                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            mlndlap_set_stencil_s0(i, j, k, stenarr);
                            sync_resid_a(i,j,k) = mlndlap_adotx_sten(i,j,k, phiarr, stenarr, tmpmaskarr);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
                }
                else
#endif
                {
                    Array4<Real> sigmaarr = uarr;
                    const Box& ovlp2 = ccvbx & ccbxg1;
                    if (sigma_orig) {
                        Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (ovlp2.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sigmaarr(i,j,k) = sigmaarr_orig(i,j,k);
                            } else {
                                sigmaarr(i,j,k) = 0.0;
                            }
                        });
                    } else {
                        Real const_sigma = m_const_sigma;
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (ovlp2.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sigmaarr(i,j,k) = const_sigma;
                            } else {
                                sigmaarr(i,j,k) = 0.0;
                            }
                        });
                    }

#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i,j,k, phiarr, sigmaarr, tmpmaskarr,
                                                                   is_rz, dxinv);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
#else
                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i,j,k, phiarr, sigmaarr, tmpmaskarr,
                                                                   dxinv);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
#endif
                }
            }

            // Do not impose neumann bc here because how SyncRegister works.
        }
    }
}